

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optional.t.cpp
# Opt level: O0

void relop<char,int,long>(env *lest_env)

{
  ostream *poVar1;
  bool bVar2;
  failure *pfVar3;
  undefined1 local_d7a8 [103];
  allocator local_d741;
  string local_d740 [32];
  string local_d720 [39];
  allocator local_d6f9;
  string local_d6f8 [32];
  string local_d6d8 [32];
  location local_d6b8;
  location local_d690;
  message local_d668;
  undefined1 local_d5e9;
  string local_d5e8 [39];
  allocator local_d5c1;
  string local_d5c0 [32];
  string local_d5a0 [39];
  allocator local_d579;
  string local_d578 [32];
  string local_d558 [32];
  location local_d538;
  location local_d510;
  failure local_d4e8;
  int local_d470;
  expression_decomposer local_d469;
  int *local_d468;
  result local_d460;
  undefined1 local_d438 [8];
  result score_43;
  string local_d408 [32];
  string local_d3e8 [32];
  undefined1 local_d3c8 [8];
  ctx lest__ctx_section_43;
  int lest__count_44;
  int lest__section_44;
  undefined1 local_d2c0 [103];
  allocator local_d259;
  string local_d258 [32];
  string local_d238 [39];
  allocator local_d211;
  string local_d210 [32];
  string local_d1f0 [32];
  location local_d1d0;
  location local_d1a8;
  message local_d180;
  undefined1 local_d101;
  string local_d100 [39];
  allocator local_d0d9;
  string local_d0d8 [32];
  string local_d0b8 [39];
  allocator local_d091;
  string local_d090 [32];
  string local_d070 [32];
  location local_d050;
  location local_d028;
  failure local_d000;
  int local_cf88;
  expression_decomposer local_cf81;
  optional<long> *local_cf80;
  result local_cf78;
  undefined1 local_cf50 [8];
  result score_42;
  string local_cf20 [32];
  string local_cf00 [32];
  undefined1 local_cee0 [8];
  ctx lest__ctx_section_42;
  int lest__count_43;
  int lest__section_43;
  undefined1 local_cdd8 [103];
  allocator local_cd71;
  string local_cd70 [32];
  string local_cd50 [39];
  allocator local_cd29;
  string local_cd28 [32];
  string local_cd08 [32];
  location local_cce8;
  location local_ccc0;
  message local_cc98;
  undefined1 local_cc19;
  string local_cc18 [39];
  allocator local_cbf1;
  string local_cbf0 [32];
  string local_cbd0 [39];
  allocator local_cba9;
  string local_cba8 [32];
  string local_cb88 [32];
  location local_cb68;
  location local_cb40;
  failure local_cb18;
  int local_caa0;
  expression_decomposer local_ca99;
  int *local_ca98;
  result local_ca90;
  undefined1 local_ca68 [8];
  result score_41;
  string local_ca38 [32];
  string local_ca18 [32];
  undefined1 local_c9f8 [8];
  ctx lest__ctx_section_41;
  int lest__count_42;
  int lest__section_42;
  undefined1 local_c8f0 [103];
  allocator local_c889;
  string local_c888 [32];
  string local_c868 [39];
  allocator local_c841;
  string local_c840 [32];
  string local_c820 [32];
  location local_c800;
  location local_c7d8;
  message local_c7b0;
  undefined1 local_c731;
  string local_c730 [39];
  allocator local_c709;
  string local_c708 [32];
  string local_c6e8 [39];
  allocator local_c6c1;
  string local_c6c0 [32];
  string local_c6a0 [32];
  location local_c680;
  location local_c658;
  failure local_c630;
  int local_c5b8;
  expression_decomposer local_c5b1;
  optional<long> *local_c5b0;
  result local_c5a8;
  undefined1 local_c580 [8];
  result score_40;
  string local_c550 [32];
  string local_c530 [32];
  undefined1 local_c510 [8];
  ctx lest__ctx_section_40;
  int lest__count_41;
  int lest__section_41;
  undefined1 local_c408 [103];
  allocator local_c3a1;
  string local_c3a0 [32];
  string local_c380 [39];
  allocator local_c359;
  string local_c358 [32];
  string local_c338 [32];
  location local_c318;
  location local_c2f0;
  message local_c2c8;
  undefined1 local_c249;
  string local_c248 [39];
  allocator local_c221;
  string local_c220 [32];
  string local_c200 [39];
  allocator local_c1d9;
  string local_c1d8 [32];
  string local_c1b8 [32];
  location local_c198;
  location local_c170;
  failure local_c148;
  int local_c0d0;
  expression_decomposer local_c0c9;
  int *local_c0c8;
  result local_c0c0;
  undefined1 local_c098 [8];
  result score_39;
  string local_c068 [32];
  string local_c048 [32];
  undefined1 local_c028 [8];
  ctx lest__ctx_section_39;
  int lest__count_40;
  int lest__section_40;
  undefined1 local_bf20 [103];
  allocator local_beb9;
  string local_beb8 [32];
  string local_be98 [39];
  allocator local_be71;
  string local_be70 [32];
  string local_be50 [32];
  location local_be30;
  location local_be08;
  message local_bde0;
  undefined1 local_bd61;
  string local_bd60 [39];
  allocator local_bd39;
  string local_bd38 [32];
  string local_bd18 [39];
  allocator local_bcf1;
  string local_bcf0 [32];
  string local_bcd0 [32];
  location local_bcb0;
  location local_bc88;
  failure local_bc60;
  int local_bbe8;
  expression_decomposer local_bbe1;
  optional<int> *local_bbe0;
  result local_bbd8;
  undefined1 local_bbb0 [8];
  result score_38;
  string local_bb80 [32];
  string local_bb60 [32];
  undefined1 local_bb40 [8];
  ctx lest__ctx_section_38;
  int lest__count_39;
  int lest__section_39;
  undefined1 local_ba38 [103];
  allocator local_b9d1;
  string local_b9d0 [32];
  string local_b9b0 [39];
  allocator local_b989;
  string local_b988 [32];
  string local_b968 [32];
  location local_b948;
  location local_b920;
  message local_b8f8;
  undefined1 local_b879;
  string local_b878 [39];
  allocator local_b851;
  string local_b850 [32];
  string local_b830 [39];
  allocator local_b809;
  string local_b808 [32];
  string local_b7e8 [32];
  location local_b7c8;
  location local_b7a0;
  failure local_b778;
  int local_b700;
  expression_decomposer local_b6f9;
  int *local_b6f8;
  result local_b6f0;
  undefined1 local_b6c8 [8];
  result score_37;
  string local_b698 [32];
  string local_b678 [32];
  undefined1 local_b658 [8];
  ctx lest__ctx_section_37;
  int lest__count_38;
  int lest__section_38;
  undefined1 local_b550 [103];
  allocator local_b4e9;
  string local_b4e8 [32];
  string local_b4c8 [39];
  allocator local_b4a1;
  string local_b4a0 [32];
  string local_b480 [32];
  location local_b460;
  location local_b438;
  message local_b410;
  undefined1 local_b391;
  string local_b390 [39];
  allocator local_b369;
  string local_b368 [32];
  string local_b348 [39];
  allocator local_b321;
  string local_b320 [32];
  string local_b300 [32];
  location local_b2e0;
  location local_b2b8;
  failure local_b290;
  int local_b218;
  expression_decomposer local_b211;
  optional<int> *local_b210;
  result local_b208;
  undefined1 local_b1e0 [8];
  result score_36;
  string local_b1b0 [32];
  string local_b190 [32];
  undefined1 local_b170 [8];
  ctx lest__ctx_section_36;
  int lest__count_37;
  int lest__section_37;
  undefined1 local_b068 [103];
  allocator local_b001;
  string local_b000 [32];
  string local_afe0 [39];
  allocator local_afb9;
  string local_afb8 [32];
  string local_af98 [32];
  location local_af78;
  location local_af50;
  message local_af28;
  undefined1 local_aea9;
  string local_aea8 [39];
  allocator local_ae81;
  string local_ae80 [32];
  string local_ae60 [39];
  allocator local_ae39;
  string local_ae38 [32];
  string local_ae18 [32];
  location local_adf8;
  location local_add0;
  failure local_ada8;
  int local_ad30;
  expression_decomposer local_ad29;
  int *local_ad28;
  result local_ad20;
  undefined1 local_acf8 [8];
  result score_35;
  string local_acc8 [32];
  string local_aca8 [32];
  undefined1 local_ac88 [8];
  ctx lest__ctx_section_35;
  int lest__count_36;
  int lest__section_36;
  undefined1 local_ab80 [103];
  allocator local_ab19;
  string local_ab18 [32];
  string local_aaf8 [39];
  allocator local_aad1;
  string local_aad0 [32];
  string local_aab0 [32];
  location local_aa90;
  location local_aa68;
  message local_aa40;
  undefined1 local_a9c1;
  string local_a9c0 [39];
  allocator local_a999;
  string local_a998 [32];
  string local_a978 [39];
  allocator local_a951;
  string local_a950 [32];
  string local_a930 [32];
  location local_a910;
  location local_a8e8;
  failure local_a8c0;
  int local_a848;
  expression_decomposer local_a841;
  optional<int> *local_a840;
  result local_a838;
  undefined1 local_a810 [8];
  result score_34;
  string local_a7e0 [32];
  string local_a7c0 [32];
  undefined1 local_a7a0 [8];
  ctx lest__ctx_section_34;
  int lest__count_35;
  int lest__section_35;
  undefined1 local_a698 [103];
  allocator local_a631;
  string local_a630 [32];
  string local_a610 [39];
  allocator local_a5e9;
  string local_a5e8 [32];
  string local_a5c8 [32];
  location local_a5a8;
  location local_a580;
  message local_a558;
  undefined1 local_a4d9;
  string local_a4d8 [39];
  allocator local_a4b1;
  string local_a4b0 [32];
  string local_a490 [39];
  allocator local_a469;
  string local_a468 [32];
  string local_a448 [32];
  location local_a428;
  location local_a400;
  failure local_a3d8;
  int local_a360;
  expression_decomposer local_a359;
  int *local_a358;
  result local_a350;
  undefined1 local_a328 [8];
  result score_33;
  string local_a2f8 [32];
  string local_a2d8 [32];
  undefined1 local_a2b8 [8];
  ctx lest__ctx_section_33;
  int lest__count_34;
  int lest__section_34;
  undefined1 local_a1b0 [103];
  allocator local_a149;
  string local_a148 [32];
  string local_a128 [39];
  allocator local_a101;
  string local_a100 [32];
  string local_a0e0 [32];
  location local_a0c0;
  location local_a098;
  message local_a070;
  undefined1 local_9ff1;
  string local_9ff0 [39];
  allocator local_9fc9;
  string local_9fc8 [32];
  string local_9fa8 [39];
  allocator local_9f81;
  string local_9f80 [32];
  string local_9f60 [32];
  location local_9f40;
  location local_9f18;
  failure local_9ef0;
  int local_9e78;
  expression_decomposer local_9e71;
  optional<int> *local_9e70;
  result local_9e68;
  undefined1 local_9e40 [8];
  result score_32;
  string local_9e10 [32];
  string local_9df0 [32];
  undefined1 local_9dd0 [8];
  ctx lest__ctx_section_32;
  int lest__count_33;
  int lest__section_33;
  undefined1 local_9cc8 [103];
  allocator local_9c61;
  string local_9c60 [32];
  string local_9c40 [39];
  allocator local_9c19;
  string local_9c18 [32];
  string local_9bf8 [32];
  location local_9bd8;
  location local_9bb0;
  message local_9b88;
  undefined1 local_9b09;
  string local_9b08 [39];
  allocator local_9ae1;
  string local_9ae0 [32];
  string local_9ac0 [39];
  allocator local_9a99;
  string local_9a98 [32];
  string local_9a78 [32];
  location local_9a58;
  location local_9a30;
  failure local_9a08;
  bool local_998a;
  expression_decomposer local_9989;
  bool *local_9988;
  result local_9980;
  undefined1 local_9958 [8];
  result score_31;
  string local_9928 [32];
  string local_9908 [32];
  undefined1 local_98e8 [8];
  ctx lest__ctx_section_31;
  int lest__count_32;
  int lest__section_32;
  undefined1 local_97e0 [103];
  allocator local_9779;
  string local_9778 [32];
  string local_9758 [39];
  allocator local_9731;
  string local_9730 [32];
  string local_9710 [32];
  location local_96f0;
  location local_96c8;
  message local_96a0;
  undefined1 local_9621;
  string local_9620 [39];
  allocator local_95f9;
  string local_95f8 [32];
  string local_95d8 [39];
  allocator local_95b1;
  string local_95b0 [32];
  string local_9590 [32];
  location local_9570;
  location local_9548;
  failure local_9520;
  bool local_94a2;
  expression_decomposer local_94a1;
  bool *local_94a0;
  result local_9498;
  undefined1 local_9470 [8];
  result score_30;
  string local_9440 [32];
  string local_9420 [32];
  undefined1 local_9400 [8];
  ctx lest__ctx_section_30;
  int lest__count_31;
  int lest__section_31;
  undefined1 local_92f8 [103];
  allocator local_9291;
  string local_9290 [32];
  string local_9270 [39];
  allocator local_9249;
  string local_9248 [32];
  string local_9228 [32];
  location local_9208;
  location local_91e0;
  message local_91b8;
  undefined1 local_9139;
  string local_9138 [39];
  allocator local_9111;
  string local_9110 [32];
  string local_90f0 [39];
  allocator local_90c9;
  string local_90c8 [32];
  string local_90a8 [32];
  location local_9088;
  location local_9060;
  failure local_9038;
  bool local_8fba;
  expression_decomposer local_8fb9;
  bool *local_8fb8;
  result local_8fb0;
  undefined1 local_8f88 [8];
  result score_29;
  string local_8f58 [32];
  string local_8f38 [32];
  undefined1 local_8f18 [8];
  ctx lest__ctx_section_29;
  int lest__count_30;
  int lest__section_30;
  undefined1 local_8e10 [103];
  allocator local_8da9;
  string local_8da8 [32];
  string local_8d88 [39];
  allocator local_8d61;
  string local_8d60 [32];
  string local_8d40 [32];
  location local_8d20;
  location local_8cf8;
  message local_8cd0;
  undefined1 local_8c51;
  string local_8c50 [39];
  allocator local_8c29;
  string local_8c28 [32];
  string local_8c08 [39];
  allocator local_8be1;
  string local_8be0 [32];
  string local_8bc0 [32];
  location local_8ba0;
  location local_8b78;
  failure local_8b50;
  bool local_8ad2;
  expression_decomposer local_8ad1;
  bool *local_8ad0;
  result local_8ac8;
  undefined1 local_8aa0 [8];
  result score_28;
  string local_8a70 [32];
  string local_8a50 [32];
  undefined1 local_8a30 [8];
  ctx lest__ctx_section_28;
  int lest__count_29;
  int lest__section_29;
  undefined1 local_8928 [103];
  allocator local_88c1;
  string local_88c0 [32];
  string local_88a0 [39];
  allocator local_8879;
  string local_8878 [32];
  string local_8858 [32];
  location local_8838;
  location local_8810;
  message local_87e8;
  undefined1 local_8769;
  string local_8768 [39];
  allocator local_8741;
  string local_8740 [32];
  string local_8720 [39];
  allocator local_86f9;
  string local_86f8 [32];
  string local_86d8 [32];
  location local_86b8;
  location local_8690;
  failure local_8668;
  bool local_85ea;
  expression_decomposer local_85e9;
  bool *local_85e8;
  result local_85e0;
  undefined1 local_85b8 [8];
  result score_27;
  string local_8588 [32];
  string local_8568 [32];
  undefined1 local_8548 [8];
  ctx lest__ctx_section_27;
  int lest__count_28;
  int lest__section_28;
  undefined1 local_8440 [103];
  allocator local_83d9;
  string local_83d8 [32];
  string local_83b8 [39];
  allocator local_8391;
  string local_8390 [32];
  string local_8370 [32];
  location local_8350;
  location local_8328;
  message local_8300;
  undefined1 local_8281;
  string local_8280 [39];
  allocator local_8259;
  string local_8258 [32];
  string local_8238 [39];
  allocator local_8211;
  string local_8210 [32];
  string local_81f0 [32];
  location local_81d0;
  location local_81a8;
  failure local_8180;
  bool local_8102;
  expression_decomposer local_8101;
  bool *local_8100;
  result local_80f8;
  undefined1 local_80d0 [8];
  result score_26;
  string local_80a0 [32];
  string local_8080 [32];
  undefined1 local_8060 [8];
  ctx lest__ctx_section_26;
  int lest__count_27;
  int lest__section_27;
  undefined1 local_7f58 [103];
  allocator local_7ef1;
  string local_7ef0 [32];
  string local_7ed0 [39];
  allocator local_7ea9;
  string local_7ea8 [32];
  string local_7e88 [32];
  location local_7e68;
  location local_7e40;
  message local_7e18;
  undefined1 local_7d99;
  string local_7d98 [39];
  allocator local_7d71;
  string local_7d70 [32];
  string local_7d50 [39];
  allocator local_7d29;
  string local_7d28 [32];
  string local_7d08 [32];
  location local_7ce8;
  location local_7cc0;
  failure local_7c98;
  bool local_7c1a;
  expression_decomposer local_7c19;
  bool *local_7c18;
  result local_7c10;
  undefined1 local_7be8 [8];
  result score_25;
  string local_7bb8 [32];
  string local_7b98 [32];
  undefined1 local_7b78 [8];
  ctx lest__ctx_section_25;
  int lest__count_26;
  int lest__section_26;
  undefined1 local_7a70 [103];
  allocator local_7a09;
  string local_7a08 [32];
  string local_79e8 [39];
  allocator local_79c1;
  string local_79c0 [32];
  string local_79a0 [32];
  location local_7980;
  location local_7958;
  message local_7930;
  undefined1 local_78b1;
  string local_78b0 [39];
  allocator local_7889;
  string local_7888 [32];
  string local_7868 [39];
  allocator local_7841;
  string local_7840 [32];
  string local_7820 [32];
  location local_7800;
  location local_77d8;
  failure local_77b0;
  bool local_7732;
  expression_decomposer local_7731;
  bool *local_7730;
  result local_7728;
  undefined1 local_7700 [8];
  result score_24;
  string local_76d0 [32];
  string local_76b0 [32];
  undefined1 local_7690 [8];
  ctx lest__ctx_section_24;
  int lest__count_25;
  int lest__section_25;
  undefined1 local_7588 [103];
  allocator local_7521;
  string local_7520 [32];
  string local_7500 [39];
  allocator local_74d9;
  string local_74d8 [32];
  string local_74b8 [32];
  location local_7498;
  location local_7470;
  message local_7448;
  undefined1 local_73c9;
  string local_73c8 [39];
  allocator local_73a1;
  string local_73a0 [32];
  string local_7380 [39];
  allocator local_7359;
  string local_7358 [32];
  string local_7338 [32];
  location local_7318;
  location local_72f0;
  failure local_72c8;
  bool local_724a;
  expression_decomposer local_7249;
  bool *local_7248;
  result local_7240;
  undefined1 local_7218 [8];
  result score_23;
  string local_71e8 [32];
  string local_71c8 [32];
  undefined1 local_71a8 [8];
  ctx lest__ctx_section_23;
  int lest__count_24;
  int lest__section_24;
  undefined1 local_70a0 [103];
  allocator local_7039;
  string local_7038 [32];
  string local_7018 [39];
  allocator local_6ff1;
  string local_6ff0 [32];
  string local_6fd0 [32];
  location local_6fb0;
  location local_6f88;
  message local_6f60;
  undefined1 local_6ee1;
  string local_6ee0 [39];
  allocator local_6eb9;
  string local_6eb8 [32];
  string local_6e98 [39];
  allocator local_6e71;
  string local_6e70 [32];
  string local_6e50 [32];
  location local_6e30;
  location local_6e08;
  failure local_6de0;
  bool local_6d62;
  expression_decomposer local_6d61;
  bool *local_6d60;
  result local_6d58;
  undefined1 local_6d30 [8];
  result score_22;
  string local_6d00 [32];
  string local_6ce0 [32];
  undefined1 local_6cc0 [8];
  ctx lest__ctx_section_22;
  int lest__count_23;
  int lest__section_23;
  undefined1 local_6bb8 [103];
  allocator local_6b51;
  string local_6b50 [32];
  string local_6b30 [39];
  allocator local_6b09;
  string local_6b08 [32];
  string local_6ae8 [32];
  location local_6ac8;
  location local_6aa0;
  message local_6a78;
  undefined1 local_69f9;
  string local_69f8 [39];
  allocator local_69d1;
  string local_69d0 [32];
  string local_69b0 [39];
  allocator local_6989;
  string local_6988 [32];
  string local_6968 [32];
  location local_6948;
  location local_6920;
  failure local_68f8;
  bool local_687a;
  expression_decomposer local_6879;
  bool *local_6878;
  result local_6870;
  undefined1 local_6848 [8];
  result score_21;
  string local_6818 [32];
  string local_67f8 [32];
  undefined1 local_67d8 [8];
  ctx lest__ctx_section_21;
  int lest__count_22;
  int lest__section_22;
  undefined1 local_66d0 [103];
  allocator local_6669;
  string local_6668 [32];
  string local_6648 [39];
  allocator local_6621;
  string local_6620 [32];
  string local_6600 [32];
  location local_65e0;
  location local_65b8;
  message local_6590;
  undefined1 local_6511;
  string local_6510 [39];
  allocator local_64e9;
  string local_64e8 [32];
  string local_64c8 [39];
  allocator local_64a1;
  string local_64a0 [32];
  string local_6480 [32];
  location local_6460;
  location local_6438;
  failure local_6410;
  bool local_6392;
  expression_decomposer local_6391;
  bool *local_6390;
  result local_6388;
  undefined1 local_6360 [8];
  result score_20;
  string local_6330 [32];
  string local_6310 [32];
  undefined1 local_62f0 [8];
  ctx lest__ctx_section_20;
  int lest__count_21;
  int lest__section_21;
  undefined1 local_61e8 [103];
  allocator local_6181;
  string local_6180 [32];
  string local_6160 [39];
  allocator local_6139;
  string local_6138 [32];
  string local_6118 [32];
  location local_60f8;
  location local_60d0;
  message local_60a8;
  undefined1 local_6029;
  string local_6028 [39];
  allocator local_6001;
  string local_6000 [32];
  string local_5fe0 [39];
  allocator local_5fb9;
  string local_5fb8 [32];
  string local_5f98 [32];
  location local_5f78;
  location local_5f50;
  failure local_5f28;
  bool local_5eaa;
  expression_decomposer local_5ea9;
  bool *local_5ea8;
  result local_5ea0;
  undefined1 local_5e78 [8];
  result score_19;
  string local_5e48 [32];
  string local_5e28 [32];
  undefined1 local_5e08 [8];
  ctx lest__ctx_section_19;
  int lest__count_20;
  int lest__section_20;
  undefined1 local_5d00 [103];
  allocator local_5c99;
  string local_5c98 [32];
  string local_5c78 [39];
  allocator local_5c51;
  string local_5c50 [32];
  string local_5c30 [32];
  location local_5c10;
  location local_5be8;
  message local_5bc0;
  undefined1 local_5b41;
  string local_5b40 [39];
  allocator local_5b19;
  string local_5b18 [32];
  string local_5af8 [39];
  allocator local_5ad1;
  string local_5ad0 [32];
  string local_5ab0 [32];
  location local_5a90;
  location local_5a68;
  failure local_5a40;
  expression_decomposer local_59c1;
  optional<long> *local_59c0;
  result local_59b8;
  undefined1 local_5990 [8];
  result score_18;
  string local_5960 [32];
  string local_5940 [32];
  undefined1 local_5920 [8];
  ctx lest__ctx_section_18;
  int lest__count_19;
  int lest__section_19;
  undefined1 local_5818 [103];
  allocator local_57b1;
  string local_57b0 [32];
  string local_5790 [39];
  allocator local_5769;
  string local_5768 [32];
  string local_5748 [32];
  location local_5728;
  location local_5700;
  message local_56d8;
  undefined1 local_5659;
  string local_5658 [39];
  allocator local_5631;
  string local_5630 [32];
  string local_5610 [39];
  allocator local_55e9;
  string local_55e8 [32];
  string local_55c8 [32];
  location local_55a8;
  location local_5580;
  failure local_5558;
  expression_decomposer local_54d9;
  optional<long> *local_54d8;
  result local_54d0;
  undefined1 local_54a8 [8];
  result score_17;
  string local_5478 [32];
  string local_5458 [32];
  undefined1 local_5438 [8];
  ctx lest__ctx_section_17;
  int lest__count_18;
  int lest__section_18;
  undefined1 local_5330 [103];
  allocator local_52c9;
  string local_52c8 [32];
  string local_52a8 [39];
  allocator local_5281;
  string local_5280 [32];
  string local_5260 [32];
  location local_5240;
  location local_5218;
  message local_51f0;
  undefined1 local_5171;
  string local_5170 [39];
  allocator local_5149;
  string local_5148 [32];
  string local_5128 [39];
  allocator local_5101;
  string local_5100 [32];
  string local_50e0 [32];
  location local_50c0;
  location local_5098;
  failure local_5070;
  expression_decomposer local_4ff1;
  optional<int> *local_4ff0;
  result local_4fe8;
  undefined1 local_4fc0 [8];
  result score_16;
  string local_4f90 [32];
  string local_4f70 [32];
  undefined1 local_4f50 [8];
  ctx lest__ctx_section_16;
  int lest__count_17;
  int lest__section_17;
  undefined1 local_4e48 [103];
  allocator local_4de1;
  string local_4de0 [32];
  string local_4dc0 [39];
  allocator local_4d99;
  string local_4d98 [32];
  string local_4d78 [32];
  location local_4d58;
  location local_4d30;
  message local_4d08;
  undefined1 local_4c89;
  string local_4c88 [39];
  allocator local_4c61;
  string local_4c60 [32];
  string local_4c40 [39];
  allocator local_4c19;
  string local_4c18 [32];
  string local_4bf8 [32];
  location local_4bd8;
  location local_4bb0;
  failure local_4b88;
  bool local_4b0a;
  expression_decomposer local_4b09;
  bool *local_4b08;
  result local_4b00;
  undefined1 local_4ad8 [8];
  result score_15;
  string local_4aa8 [32];
  string local_4a88 [32];
  undefined1 local_4a68 [8];
  ctx lest__ctx_section_15;
  int lest__count_16;
  int lest__section_16;
  undefined1 local_4960 [103];
  allocator local_48f9;
  string local_48f8 [32];
  string local_48d8 [39];
  allocator local_48b1;
  string local_48b0 [32];
  string local_4890 [32];
  location local_4870;
  location local_4848;
  message local_4820;
  undefined1 local_47a1;
  string local_47a0 [39];
  allocator local_4779;
  string local_4778 [32];
  string local_4758 [39];
  allocator local_4731;
  string local_4730 [32];
  string local_4710 [32];
  location local_46f0;
  location local_46c8;
  failure local_46a0;
  expression_decomposer local_4621;
  optional<long> *local_4620;
  result local_4618;
  undefined1 local_45f0 [8];
  result score_14;
  string local_45c0 [32];
  string local_45a0 [32];
  undefined1 local_4580 [8];
  ctx lest__ctx_section_14;
  int lest__count_15;
  int lest__section_15;
  undefined1 local_4478 [103];
  allocator local_4411;
  string local_4410 [32];
  string local_43f0 [39];
  allocator local_43c9;
  string local_43c8 [32];
  string local_43a8 [32];
  location local_4388;
  location local_4360;
  message local_4338;
  undefined1 local_42b9;
  string local_42b8 [39];
  allocator local_4291;
  string local_4290 [32];
  string local_4270 [39];
  allocator local_4249;
  string local_4248 [32];
  string local_4228 [32];
  location local_4208;
  location local_41e0;
  failure local_41b8;
  expression_decomposer local_4139;
  optional<long> *local_4138;
  result local_4130;
  undefined1 local_4108 [8];
  result score_13;
  string local_40d8 [32];
  string local_40b8 [32];
  undefined1 local_4098 [8];
  ctx lest__ctx_section_13;
  int lest__count_14;
  int lest__section_14;
  undefined1 local_3f90 [103];
  allocator local_3f29;
  string local_3f28 [32];
  string local_3f08 [39];
  allocator local_3ee1;
  string local_3ee0 [32];
  string local_3ec0 [32];
  location local_3ea0;
  location local_3e78;
  message local_3e50;
  undefined1 local_3dd1;
  string local_3dd0 [39];
  allocator local_3da9;
  string local_3da8 [32];
  string local_3d88 [39];
  allocator local_3d61;
  string local_3d60 [32];
  string local_3d40 [32];
  location local_3d20;
  location local_3cf8;
  failure local_3cd0;
  expression_decomposer local_3c51;
  optional<char> *local_3c50;
  result local_3c48;
  undefined1 local_3c20 [8];
  result score_12;
  string local_3bf0 [32];
  string local_3bd0 [32];
  undefined1 local_3bb0 [8];
  ctx lest__ctx_section_12;
  int lest__count_13;
  int lest__section_13;
  undefined1 local_3aa8 [103];
  allocator local_3a41;
  string local_3a40 [32];
  string local_3a20 [39];
  allocator local_39f9;
  string local_39f8 [32];
  string local_39d8 [32];
  location local_39b8;
  location local_3990;
  message local_3968;
  undefined1 local_38e9;
  string local_38e8 [39];
  allocator local_38c1;
  string local_38c0 [32];
  string local_38a0 [39];
  allocator local_3879;
  string local_3878 [32];
  string local_3858 [32];
  location local_3838;
  location local_3810;
  failure local_37e8;
  bool local_376a;
  expression_decomposer local_3769;
  bool *local_3768;
  result local_3760;
  undefined1 local_3738 [8];
  result score_11;
  string local_3708 [32];
  string local_36e8 [32];
  undefined1 local_36c8 [8];
  ctx lest__ctx_section_11;
  int lest__count_12;
  int lest__section_12;
  undefined1 local_35c0 [103];
  allocator local_3559;
  string local_3558 [32];
  string local_3538 [39];
  allocator local_3511;
  string local_3510 [32];
  string local_34f0 [32];
  location local_34d0;
  location local_34a8;
  message local_3480;
  undefined1 local_3401;
  string local_3400 [39];
  allocator local_33d9;
  string local_33d8 [32];
  string local_33b8 [39];
  allocator local_3391;
  string local_3390 [32];
  string local_3370 [32];
  location local_3350;
  location local_3328;
  failure local_3300;
  expression_decomposer local_3281;
  optional<int> *local_3280;
  result local_3278;
  undefined1 local_3250 [8];
  result score_10;
  string local_3220 [32];
  string local_3200 [32];
  undefined1 local_31e0 [8];
  ctx lest__ctx_section_10;
  int lest__count_11;
  int lest__section_11;
  undefined1 local_30d8 [103];
  allocator local_3071;
  string local_3070 [32];
  string local_3050 [39];
  allocator local_3029;
  string local_3028 [32];
  string local_3008 [32];
  location local_2fe8;
  location local_2fc0;
  message local_2f98;
  undefined1 local_2f19;
  string local_2f18 [39];
  allocator local_2ef1;
  string local_2ef0 [32];
  string local_2ed0 [39];
  allocator local_2ea9;
  string local_2ea8 [32];
  string local_2e88 [32];
  location local_2e68;
  location local_2e40;
  failure local_2e18;
  expression_decomposer local_2d99;
  optional<int> *local_2d98;
  result local_2d90;
  undefined1 local_2d68 [8];
  result score_9;
  string local_2d38 [32];
  string local_2d18 [32];
  undefined1 local_2cf8 [8];
  ctx lest__ctx_section_9;
  int lest__count_10;
  int lest__section_10;
  undefined1 local_2bf0 [103];
  allocator local_2b89;
  string local_2b88 [32];
  string local_2b68 [39];
  allocator local_2b41;
  string local_2b40 [32];
  string local_2b20 [32];
  location local_2b00;
  location local_2ad8;
  message local_2ab0;
  undefined1 local_2a31;
  string local_2a30 [39];
  allocator local_2a09;
  string local_2a08 [32];
  string local_29e8 [39];
  allocator local_29c1;
  string local_29c0 [32];
  string local_29a0 [32];
  location local_2980;
  location local_2958;
  failure local_2930;
  expression_decomposer local_28b1;
  optional<char> *local_28b0;
  result local_28a8;
  undefined1 local_2880 [8];
  result score_8;
  string local_2850 [32];
  string local_2830 [32];
  undefined1 local_2810 [8];
  ctx lest__ctx_section_8;
  int lest__count_9;
  int lest__section_9;
  undefined1 local_2708 [103];
  allocator local_26a1;
  string local_26a0 [32];
  string local_2680 [39];
  allocator local_2659;
  string local_2658 [32];
  string local_2638 [32];
  location local_2618;
  location local_25f0;
  message local_25c8;
  undefined1 local_2549;
  string local_2548 [39];
  allocator local_2521;
  string local_2520 [32];
  string local_2500 [39];
  allocator local_24d9;
  string local_24d8 [32];
  string local_24b8 [32];
  location local_2498;
  location local_2470;
  failure local_2448;
  bool local_23ca;
  expression_decomposer local_23c9;
  bool *local_23c8;
  result local_23c0;
  undefined1 local_2398 [8];
  result score_7;
  string local_2368 [32];
  string local_2348 [32];
  undefined1 local_2328 [8];
  ctx lest__ctx_section_7;
  int lest__count_8;
  int lest__section_8;
  undefined1 local_2220 [103];
  allocator local_21b9;
  string local_21b8 [32];
  string local_2198 [39];
  allocator local_2171;
  string local_2170 [32];
  string local_2150 [32];
  location local_2130;
  location local_2108;
  message local_20e0;
  undefined1 local_2061;
  string local_2060 [39];
  allocator local_2039;
  string local_2038 [32];
  string local_2018 [39];
  allocator local_1ff1;
  string local_1ff0 [32];
  string local_1fd0 [32];
  location local_1fb0;
  location local_1f88;
  failure local_1f60;
  expression_decomposer local_1ee1;
  optional<int> *local_1ee0;
  result local_1ed8;
  undefined1 local_1eb0 [8];
  result score_6;
  string local_1e80 [32];
  string local_1e60 [32];
  undefined1 local_1e40 [8];
  ctx lest__ctx_section_6;
  int lest__count_7;
  int lest__section_7;
  undefined1 local_1d38 [103];
  allocator local_1cd1;
  string local_1cd0 [32];
  string local_1cb0 [39];
  allocator local_1c89;
  string local_1c88 [32];
  string local_1c68 [32];
  location local_1c48;
  location local_1c20;
  message local_1bf8;
  undefined1 local_1b79;
  string local_1b78 [39];
  allocator local_1b51;
  string local_1b50 [32];
  string local_1b30 [39];
  allocator local_1b09;
  string local_1b08 [32];
  string local_1ae8 [32];
  location local_1ac8;
  location local_1aa0;
  failure local_1a78;
  expression_decomposer local_19f9;
  optional<char> *local_19f8;
  result local_19f0;
  undefined1 local_19c8 [8];
  result score_5;
  string local_1998 [32];
  string local_1978 [32];
  undefined1 local_1958 [8];
  ctx lest__ctx_section_5;
  int lest__count_6;
  int lest__section_6;
  undefined1 local_1850 [103];
  allocator local_17e9;
  string local_17e8 [32];
  string local_17c8 [39];
  allocator local_17a1;
  string local_17a0 [32];
  string local_1780 [32];
  location local_1760;
  location local_1738;
  message local_1710;
  undefined1 local_1691;
  string local_1690 [39];
  allocator local_1669;
  string local_1668 [32];
  string local_1648 [39];
  allocator local_1621;
  string local_1620 [32];
  string local_1600 [32];
  location local_15e0;
  location local_15b8;
  failure local_1590;
  expression_decomposer local_1511;
  optional<int> *local_1510;
  result local_1508;
  undefined1 local_14e0 [8];
  result score_4;
  string local_14b0 [32];
  string local_1490 [32];
  undefined1 local_1470 [8];
  ctx lest__ctx_section_4;
  int lest__count_5;
  int lest__section_5;
  undefined1 local_1368 [103];
  allocator local_1301;
  string local_1300 [32];
  string local_12e0 [39];
  allocator local_12b9;
  string local_12b8 [32];
  string local_1298 [32];
  location local_1278;
  location local_1250;
  message local_1228;
  undefined1 local_11a9;
  string local_11a8 [39];
  allocator local_1181;
  string local_1180 [32];
  string local_1160 [39];
  allocator local_1139;
  string local_1138 [32];
  string local_1118 [32];
  location local_10f8;
  location local_10d0;
  failure local_10a8;
  expression_decomposer local_1029;
  optional<int> *local_1028;
  result local_1020;
  undefined1 local_ff8 [8];
  result score_3;
  string local_fc8 [32];
  string local_fa8 [32];
  undefined1 local_f88 [8];
  ctx lest__ctx_section_3;
  int lest__count_4;
  int lest__section_4;
  undefined1 local_e80 [103];
  allocator local_e19;
  string local_e18 [32];
  string local_df8 [39];
  allocator local_dd1;
  string local_dd0 [32];
  string local_db0 [32];
  location local_d90;
  location local_d68;
  message local_d40;
  undefined1 local_cc1;
  string local_cc0 [39];
  allocator local_c99;
  string local_c98 [32];
  string local_c78 [39];
  allocator local_c51;
  string local_c50 [32];
  string local_c30 [32];
  location local_c10;
  location local_be8;
  failure local_bc0;
  bool local_b42;
  expression_decomposer local_b41;
  bool *local_b40;
  result local_b38;
  undefined1 local_b10 [8];
  result score_2;
  string local_ae0 [32];
  string local_ac0 [32];
  undefined1 local_aa0 [8];
  ctx lest__ctx_section_2;
  int lest__count_3;
  int lest__section_3;
  undefined1 local_998 [103];
  allocator local_931;
  string local_930 [32];
  string local_910 [39];
  allocator local_8e9;
  string local_8e8 [32];
  string local_8c8 [32];
  location local_8a8;
  location local_880;
  message local_858;
  undefined1 local_7d9;
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  string local_790 [39];
  allocator local_769;
  string local_768 [32];
  string local_748 [32];
  location local_728;
  location local_700;
  failure local_6d8;
  bool local_65a;
  expression_decomposer local_659;
  bool *local_658;
  result local_650;
  undefined1 local_628 [8];
  result score_1;
  string local_5f8 [32];
  string local_5d8 [32];
  undefined1 local_5b8 [8];
  ctx lest__ctx_section_1;
  int lest__count_2;
  int lest__section_2;
  undefined1 local_4b0 [103];
  allocator local_449;
  string local_448 [32];
  string local_428 [39];
  allocator local_401;
  string local_400 [32];
  string local_3e0 [32];
  location local_3c0;
  location local_398;
  message local_370;
  undefined1 local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  string local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  string local_260 [32];
  location local_240;
  location local_218;
  failure local_1f0;
  expression_decomposer local_171;
  optional<int> *local_170;
  result local_168;
  undefined1 local_140 [8];
  result score;
  string local_110 [32];
  string local_f0 [32];
  undefined1 local_d0 [8];
  ctx lest__ctx_section;
  int lest__count_1;
  int lest__section_1;
  int local_a4;
  undefined1 local_a0 [8];
  optional<long> e2;
  optional<int> e1;
  optional<char> d;
  allocator local_69;
  string local_68 [32];
  string local_48 [32];
  undefined1 local_28 [8];
  ctx lest__ctx_setup;
  int lest__count;
  int lest__section;
  env *lest_env_local;
  
  lest__ctx_setup._12_4_ = 0;
  lest__ctx_setup.once = true;
  lest__ctx_setup._9_3_ = 0;
  do {
    if ((int)lest__ctx_setup._8_4_ <= (int)lest__ctx_setup._12_4_) {
      return;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"",&local_69);
    std::__cxx11::string::string(local_48,local_68);
    lest::ctx::ctx((ctx *)local_28,lest_env,(text *)local_48);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_28), bVar2) {
      nonstd::optional_lite::optional<char>::optional((optional<char> *)&e1.field_0x2);
      e2.contained._0_4_ = 6;
      nonstd::optional_lite::optional<int>::optional<int,_0>
                ((optional<int> *)((long)&e2.contained + 4),(int *)&e2.contained);
      local_a4 = 7;
      nonstd::optional_lite::optional<long>::optional<int,_0>((optional<long> *)local_a0,&local_a4);
      lest::guard::guard((guard *)&lest__count_1,&relop<char,_int,_long>::id1330,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_1);
      if (bVar2) {
        lest__ctx_section.once = true;
        lest__ctx_section._9_3_ = 0;
        for (lest__ctx_section._12_4_ = 0;
            (int)lest__ctx_section._12_4_ < (int)lest__ctx_section._8_4_;
            lest__ctx_section._12_4_ = lest__ctx_section._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_110,"engaged    == engaged",(allocator *)&score.field_0x27);
          std::__cxx11::string::string(local_f0,local_110);
          lest::ctx::ctx((ctx *)local_d0,lest_env,(text *)local_f0);
          std::__cxx11::string::~string(local_f0);
          std::__cxx11::string::~string(local_110);
          std::allocator<char>::~allocator((allocator<char> *)&score.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_d0), bVar2) {
            do {
              local_170 = (optional<int> *)
                          lest::expression_decomposer::operator<<
                                    (&local_171,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator==
                        (&local_168,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_170,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_140,&local_168);
              lest::result::~result(&local_168);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_140);
              if (bVar2) {
                local_2f1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_280,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_281);
                std::__cxx11::string::string(local_260,local_280);
                lest::location::location(&local_240,(text *)local_260,0x532);
                lest::location::location(&local_218,&local_240);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2c8,"e1 == e1",&local_2c9);
                std::__cxx11::string::string(local_2a8,local_2c8);
                std::__cxx11::string::string(local_2f0,(string *)&score);
                lest::failure::failure(&local_1f0,&local_218,(text *)local_2a8,(text *)local_2f0);
                lest::failure::failure(pfVar3,&local_1f0);
                local_2f1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_400,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_401);
                std::__cxx11::string::string(local_3e0,local_400);
                lest::location::location(&local_3c0,(text *)local_3e0,0x532);
                lest::location::location(&local_398,&local_3c0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_448,"e1 == e1",&local_449);
                std::__cxx11::string::string(local_428,local_448);
                std::__cxx11::string::string((string *)(local_4b0 + 0x40),(string *)&score);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_370,&local_398,(text *)local_428,
                           (text *)(local_4b0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_4b0);
                std::__cxx11::string::string((string *)(local_4b0 + 0x20),(string *)local_4b0);
                lest::report(poVar1,&local_370,(text *)(local_4b0 + 0x20));
                std::__cxx11::string::~string((string *)(local_4b0 + 0x20));
                std::__cxx11::string::~string((string *)local_4b0);
                lest::passing::~passing((passing *)&local_370);
                std::__cxx11::string::~string((string *)(local_4b0 + 0x40));
                std::__cxx11::string::~string(local_428);
                std::__cxx11::string::~string(local_448);
                std::allocator<char>::~allocator((allocator<char> *)&local_449);
                lest::location::~location(&local_398);
                lest::location::~location(&local_3c0);
                std::__cxx11::string::~string(local_3e0);
                std::__cxx11::string::~string(local_400);
                std::allocator<char>::~allocator((allocator<char> *)&local_401);
              }
              lest::result::~result((result *)local_140);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xa;
          lest::ctx::~ctx((ctx *)local_d0);
          lest__ctx_section._8_4_ = lest__ctx_section._8_4_ - (uint)(lest__ctx_section._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_2,&relop<char,_int,_long>::id1331,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_2);
      if (bVar2) {
        lest__ctx_section_1.once = true;
        lest__ctx_section_1._9_3_ = 0;
        for (lest__ctx_section_1._12_4_ = 0;
            (int)lest__ctx_section_1._12_4_ < (int)lest__ctx_section_1._8_4_;
            lest__ctx_section_1._12_4_ = lest__ctx_section_1._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5f8,"engaged    == disengaged",(allocator *)&score_1.field_0x27);
          std::__cxx11::string::string(local_5d8,local_5f8);
          lest::ctx::ctx((ctx *)local_5b8,lest_env,(text *)local_5d8);
          std::__cxx11::string::~string(local_5d8);
          std::__cxx11::string::~string(local_5f8);
          std::allocator<char>::~allocator((allocator<char> *)&score_1.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5b8), bVar2) {
            do {
              bVar2 = nonstd::optional_lite::operator==
                                ((optional<int> *)((long)&e2.contained + 4),
                                 (optional<char> *)&e1.field_0x2);
              local_65a = (bool)(~bVar2 & 1);
              local_658 = (bool *)lest::expression_decomposer::operator<<(&local_659,&local_65a);
              lest::expression_lhs::operator_cast_to_result(&local_650,(expression_lhs *)&local_658)
              ;
              lest::result::result((result *)local_628,&local_650);
              lest::result::~result(&local_650);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_628);
              if (bVar2) {
                local_7d9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_768,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_769);
                std::__cxx11::string::string(local_748,local_768);
                lest::location::location(&local_728,(text *)local_748,0x533);
                lest::location::location(&local_700,&local_728);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7b0,"!(e1 == d )",&local_7b1);
                std::__cxx11::string::string(local_790,local_7b0);
                std::__cxx11::string::string(local_7d8,(string *)&score_1);
                lest::failure::failure(&local_6d8,&local_700,(text *)local_790,(text *)local_7d8);
                lest::failure::failure(pfVar3,&local_6d8);
                local_7d9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_8e9);
                std::__cxx11::string::string(local_8c8,local_8e8);
                lest::location::location(&local_8a8,(text *)local_8c8,0x533);
                lest::location::location(&local_880,&local_8a8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_930,"!(e1 == d )",&local_931);
                std::__cxx11::string::string(local_910,local_930);
                std::__cxx11::string::string((string *)(local_998 + 0x40),(string *)&score_1);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_858,&local_880,(text *)local_910,
                           (text *)(local_998 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_998);
                std::__cxx11::string::string((string *)(local_998 + 0x20),(string *)local_998);
                lest::report(poVar1,&local_858,(text *)(local_998 + 0x20));
                std::__cxx11::string::~string((string *)(local_998 + 0x20));
                std::__cxx11::string::~string((string *)local_998);
                lest::passing::~passing((passing *)&local_858);
                std::__cxx11::string::~string((string *)(local_998 + 0x40));
                std::__cxx11::string::~string(local_910);
                std::__cxx11::string::~string(local_930);
                std::allocator<char>::~allocator((allocator<char> *)&local_931);
                lest::location::~location(&local_880);
                lest::location::~location(&local_8a8);
                std::__cxx11::string::~string(local_8c8);
                std::__cxx11::string::~string(local_8e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
              }
              lest::result::~result((result *)local_628);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x11;
          lest::ctx::~ctx((ctx *)local_5b8);
          lest__ctx_section_1._8_4_ =
               lest__ctx_section_1._8_4_ - (uint)(lest__ctx_section_1._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_3,&relop<char,_int,_long>::id1332,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_3);
      if (bVar2) {
        lest__ctx_section_2.once = true;
        lest__ctx_section_2._9_3_ = 0;
        for (lest__ctx_section_2._12_4_ = 0;
            (int)lest__ctx_section_2._12_4_ < (int)lest__ctx_section_2._8_4_;
            lest__ctx_section_2._12_4_ = lest__ctx_section_2._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_ae0,"disengaged == engaged",(allocator *)&score_2.field_0x27);
          std::__cxx11::string::string(local_ac0,local_ae0);
          lest::ctx::ctx((ctx *)local_aa0,lest_env,(text *)local_ac0);
          std::__cxx11::string::~string(local_ac0);
          std::__cxx11::string::~string(local_ae0);
          std::allocator<char>::~allocator((allocator<char> *)&score_2.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_aa0), bVar2) {
            do {
              bVar2 = nonstd::optional_lite::operator==
                                ((optional<char> *)&e1.field_0x2,
                                 (optional<int> *)((long)&e2.contained + 4));
              local_b42 = (bool)(~bVar2 & 1);
              local_b40 = (bool *)lest::expression_decomposer::operator<<(&local_b41,&local_b42);
              lest::expression_lhs::operator_cast_to_result(&local_b38,(expression_lhs *)&local_b40)
              ;
              lest::result::result((result *)local_b10,&local_b38);
              lest::result::~result(&local_b38);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_b10);
              if (bVar2) {
                local_cc1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_c50,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_c51);
                std::__cxx11::string::string(local_c30,local_c50);
                lest::location::location(&local_c10,(text *)local_c30,0x534);
                lest::location::location(&local_be8,&local_c10);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_c98,"!(d == e1)",&local_c99);
                std::__cxx11::string::string(local_c78,local_c98);
                std::__cxx11::string::string(local_cc0,(string *)&score_2);
                lest::failure::failure(&local_bc0,&local_be8,(text *)local_c78,(text *)local_cc0);
                lest::failure::failure(pfVar3,&local_bc0);
                local_cc1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_dd0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_dd1);
                std::__cxx11::string::string(local_db0,local_dd0);
                lest::location::location(&local_d90,(text *)local_db0,0x534);
                lest::location::location(&local_d68,&local_d90);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_e18,"!(d == e1)",&local_e19);
                std::__cxx11::string::string(local_df8,local_e18);
                std::__cxx11::string::string((string *)(local_e80 + 0x40),(string *)&score_2);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_d40,&local_d68,(text *)local_df8,
                           (text *)(local_e80 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_e80);
                std::__cxx11::string::string((string *)(local_e80 + 0x20),(string *)local_e80);
                lest::report(poVar1,&local_d40,(text *)(local_e80 + 0x20));
                std::__cxx11::string::~string((string *)(local_e80 + 0x20));
                std::__cxx11::string::~string((string *)local_e80);
                lest::passing::~passing((passing *)&local_d40);
                std::__cxx11::string::~string((string *)(local_e80 + 0x40));
                std::__cxx11::string::~string(local_df8);
                std::__cxx11::string::~string(local_e18);
                std::allocator<char>::~allocator((allocator<char> *)&local_e19);
                lest::location::~location(&local_d68);
                lest::location::~location(&local_d90);
                std::__cxx11::string::~string(local_db0);
                std::__cxx11::string::~string(local_dd0);
                std::allocator<char>::~allocator((allocator<char> *)&local_dd1);
              }
              lest::result::~result((result *)local_b10);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x18;
          lest::ctx::~ctx((ctx *)local_aa0);
          lest__ctx_section_2._8_4_ =
               lest__ctx_section_2._8_4_ - (uint)(lest__ctx_section_2._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_4,&relop<char,_int,_long>::id1334,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_4);
      if (bVar2) {
        lest__ctx_section_3.once = true;
        lest__ctx_section_3._9_3_ = 0;
        for (lest__ctx_section_3._12_4_ = 0;
            (int)lest__ctx_section_3._12_4_ < (int)lest__ctx_section_3._8_4_;
            lest__ctx_section_3._12_4_ = lest__ctx_section_3._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_fc8,"engaged    != engaged",(allocator *)&score_3.field_0x27);
          std::__cxx11::string::string(local_fa8,local_fc8);
          lest::ctx::ctx((ctx *)local_f88,lest_env,(text *)local_fa8);
          std::__cxx11::string::~string(local_fa8);
          std::__cxx11::string::~string(local_fc8);
          std::allocator<char>::~allocator((allocator<char> *)&score_3.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_f88), bVar2) {
            do {
              local_1028 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1029,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                        (&local_1020,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_1028,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_ff8,&local_1020);
              lest::result::~result(&local_1020);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_ff8);
              if (bVar2) {
                local_11a9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1138,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1139);
                std::__cxx11::string::string(local_1118,local_1138);
                lest::location::location(&local_10f8,(text *)local_1118,0x536);
                lest::location::location(&local_10d0,&local_10f8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1180,"e1 != e2",&local_1181);
                std::__cxx11::string::string(local_1160,local_1180);
                std::__cxx11::string::string(local_11a8,(string *)&score_3);
                lest::failure::failure
                          (&local_10a8,&local_10d0,(text *)local_1160,(text *)local_11a8);
                lest::failure::failure(pfVar3,&local_10a8);
                local_11a9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_12b8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_12b9);
                std::__cxx11::string::string(local_1298,local_12b8);
                lest::location::location(&local_1278,(text *)local_1298,0x536);
                lest::location::location(&local_1250,&local_1278);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1300,"e1 != e2",&local_1301);
                std::__cxx11::string::string(local_12e0,local_1300);
                std::__cxx11::string::string((string *)(local_1368 + 0x40),(string *)&score_3);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1228,&local_1250,(text *)local_12e0,
                           (text *)(local_1368 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_1368);
                std::__cxx11::string::string((string *)(local_1368 + 0x20),(string *)local_1368);
                lest::report(poVar1,&local_1228,(text *)(local_1368 + 0x20));
                std::__cxx11::string::~string((string *)(local_1368 + 0x20));
                std::__cxx11::string::~string((string *)local_1368);
                lest::passing::~passing((passing *)&local_1228);
                std::__cxx11::string::~string((string *)(local_1368 + 0x40));
                std::__cxx11::string::~string(local_12e0);
                std::__cxx11::string::~string(local_1300);
                std::allocator<char>::~allocator((allocator<char> *)&local_1301);
                lest::location::~location(&local_1250);
                lest::location::~location(&local_1278);
                std::__cxx11::string::~string(local_1298);
                std::__cxx11::string::~string(local_12b8);
                std::allocator<char>::~allocator((allocator<char> *)&local_12b9);
              }
              lest::result::~result((result *)local_ff8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x1f;
          lest::ctx::~ctx((ctx *)local_f88);
          lest__ctx_section_3._8_4_ =
               lest__ctx_section_3._8_4_ - (uint)(lest__ctx_section_3._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_5,&relop<char,_int,_long>::id1335,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_5);
      if (bVar2) {
        lest__ctx_section_4.once = true;
        lest__ctx_section_4._9_3_ = 0;
        for (lest__ctx_section_4._12_4_ = 0;
            (int)lest__ctx_section_4._12_4_ < (int)lest__ctx_section_4._8_4_;
            lest__ctx_section_4._12_4_ = lest__ctx_section_4._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_14b0,"engaged    != disengaged",(allocator *)&score_4.field_0x27);
          std::__cxx11::string::string(local_1490,local_14b0);
          lest::ctx::ctx((ctx *)local_1470,lest_env,(text *)local_1490);
          std::__cxx11::string::~string(local_1490);
          std::__cxx11::string::~string(local_14b0);
          std::allocator<char>::~allocator((allocator<char> *)&score_4.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1470), bVar2) {
            do {
              local_1510 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1511,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                        (&local_1508,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_1510,
                         (optional<char> *)&e1.field_0x2);
              lest::result::result((result *)local_14e0,&local_1508);
              lest::result::~result(&local_1508);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_14e0);
              if (bVar2) {
                local_1691 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1620,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1621);
                std::__cxx11::string::string(local_1600,local_1620);
                lest::location::location(&local_15e0,(text *)local_1600,0x537);
                lest::location::location(&local_15b8,&local_15e0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1668,"e1 != d",&local_1669);
                std::__cxx11::string::string(local_1648,local_1668);
                std::__cxx11::string::string(local_1690,(string *)&score_4);
                lest::failure::failure
                          (&local_1590,&local_15b8,(text *)local_1648,(text *)local_1690);
                lest::failure::failure(pfVar3,&local_1590);
                local_1691 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_17a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_17a1);
                std::__cxx11::string::string(local_1780,local_17a0);
                lest::location::location(&local_1760,(text *)local_1780,0x537);
                lest::location::location(&local_1738,&local_1760);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_17e8,"e1 != d",&local_17e9);
                std::__cxx11::string::string(local_17c8,local_17e8);
                std::__cxx11::string::string((string *)(local_1850 + 0x40),(string *)&score_4);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1710,&local_1738,(text *)local_17c8,
                           (text *)(local_1850 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_1850);
                std::__cxx11::string::string((string *)(local_1850 + 0x20),(string *)local_1850);
                lest::report(poVar1,&local_1710,(text *)(local_1850 + 0x20));
                std::__cxx11::string::~string((string *)(local_1850 + 0x20));
                std::__cxx11::string::~string((string *)local_1850);
                lest::passing::~passing((passing *)&local_1710);
                std::__cxx11::string::~string((string *)(local_1850 + 0x40));
                std::__cxx11::string::~string(local_17c8);
                std::__cxx11::string::~string(local_17e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_17e9);
                lest::location::~location(&local_1738);
                lest::location::~location(&local_1760);
                std::__cxx11::string::~string(local_1780);
                std::__cxx11::string::~string(local_17a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_17a1);
              }
              lest::result::~result((result *)local_14e0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x26;
          lest::ctx::~ctx((ctx *)local_1470);
          lest__ctx_section_4._8_4_ =
               lest__ctx_section_4._8_4_ - (uint)(lest__ctx_section_4._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_6,&relop<char,_int,_long>::id1336,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_6);
      if (bVar2) {
        lest__ctx_section_5.once = true;
        lest__ctx_section_5._9_3_ = 0;
        for (lest__ctx_section_5._12_4_ = 0;
            (int)lest__ctx_section_5._12_4_ < (int)lest__ctx_section_5._8_4_;
            lest__ctx_section_5._12_4_ = lest__ctx_section_5._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1998,"disengaged != engaged",(allocator *)&score_5.field_0x27);
          std::__cxx11::string::string(local_1978,local_1998);
          lest::ctx::ctx((ctx *)local_1958,lest_env,(text *)local_1978);
          std::__cxx11::string::~string(local_1978);
          std::__cxx11::string::~string(local_1998);
          std::allocator<char>::~allocator((allocator<char> *)&score_5.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1958), bVar2) {
            do {
              local_19f8 = (optional<char> *)
                           lest::expression_decomposer::operator<<
                                     (&local_19f9,(optional<char> *)&e1.field_0x2);
              lest::expression_lhs<nonstd::optional_lite::optional<char>const&>::operator!=
                        (&local_19f0,
                         (expression_lhs<nonstd::optional_lite::optional<char>const&> *)&local_19f8,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_19c8,&local_19f0);
              lest::result::~result(&local_19f0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_19c8);
              if (bVar2) {
                local_1b79 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1b08,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1b09);
                std::__cxx11::string::string(local_1ae8,local_1b08);
                lest::location::location(&local_1ac8,(text *)local_1ae8,0x538);
                lest::location::location(&local_1aa0,&local_1ac8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1b50,"d != e2",&local_1b51);
                std::__cxx11::string::string(local_1b30,local_1b50);
                std::__cxx11::string::string(local_1b78,(string *)&score_5);
                lest::failure::failure
                          (&local_1a78,&local_1aa0,(text *)local_1b30,(text *)local_1b78);
                lest::failure::failure(pfVar3,&local_1a78);
                local_1b79 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1c88,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1c89);
                std::__cxx11::string::string(local_1c68,local_1c88);
                lest::location::location(&local_1c48,(text *)local_1c68,0x538);
                lest::location::location(&local_1c20,&local_1c48);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_1cd0,"d != e2",&local_1cd1);
                std::__cxx11::string::string(local_1cb0,local_1cd0);
                std::__cxx11::string::string((string *)(local_1d38 + 0x40),(string *)&score_5);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_1bf8,&local_1c20,(text *)local_1cb0,
                           (text *)(local_1d38 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_1d38);
                std::__cxx11::string::string((string *)(local_1d38 + 0x20),(string *)local_1d38);
                lest::report(poVar1,&local_1bf8,(text *)(local_1d38 + 0x20));
                std::__cxx11::string::~string((string *)(local_1d38 + 0x20));
                std::__cxx11::string::~string((string *)local_1d38);
                lest::passing::~passing((passing *)&local_1bf8);
                std::__cxx11::string::~string((string *)(local_1d38 + 0x40));
                std::__cxx11::string::~string(local_1cb0);
                std::__cxx11::string::~string(local_1cd0);
                std::allocator<char>::~allocator((allocator<char> *)&local_1cd1);
                lest::location::~location(&local_1c20);
                lest::location::~location(&local_1c48);
                std::__cxx11::string::~string(local_1c68);
                std::__cxx11::string::~string(local_1c88);
                std::allocator<char>::~allocator((allocator<char> *)&local_1c89);
              }
              lest::result::~result((result *)local_19c8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x2d;
          lest::ctx::~ctx((ctx *)local_1958);
          lest__ctx_section_5._8_4_ =
               lest__ctx_section_5._8_4_ - (uint)(lest__ctx_section_5._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_7,&relop<char,_int,_long>::id1338,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_7);
      if (bVar2) {
        lest__ctx_section_6.once = true;
        lest__ctx_section_6._9_3_ = 0;
        for (lest__ctx_section_6._12_4_ = 0;
            (int)lest__ctx_section_6._12_4_ < (int)lest__ctx_section_6._8_4_;
            lest__ctx_section_6._12_4_ = lest__ctx_section_6._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_1e80,"engaged    <  engaged",(allocator *)&score_6.field_0x27);
          std::__cxx11::string::string(local_1e60,local_1e80);
          lest::ctx::ctx((ctx *)local_1e40,lest_env,(text *)local_1e60);
          std::__cxx11::string::~string(local_1e60);
          std::__cxx11::string::~string(local_1e80);
          std::allocator<char>::~allocator((allocator<char> *)&score_6.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_1e40), bVar2) {
            do {
              local_1ee0 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_1ee1,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<
                        (&local_1ed8,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_1ee0,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_1eb0,&local_1ed8);
              lest::result::~result(&local_1ed8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_1eb0);
              if (bVar2) {
                local_2061 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_1ff0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_1ff1);
                std::__cxx11::string::string(local_1fd0,local_1ff0);
                lest::location::location(&local_1fb0,(text *)local_1fd0,0x53a);
                lest::location::location(&local_1f88,&local_1fb0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2038,"e1 < e2",&local_2039);
                std::__cxx11::string::string(local_2018,local_2038);
                std::__cxx11::string::string(local_2060,(string *)&score_6);
                lest::failure::failure
                          (&local_1f60,&local_1f88,(text *)local_2018,(text *)local_2060);
                lest::failure::failure(pfVar3,&local_1f60);
                local_2061 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_2170,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2171);
                std::__cxx11::string::string(local_2150,local_2170);
                lest::location::location(&local_2130,(text *)local_2150,0x53a);
                lest::location::location(&local_2108,&local_2130);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_21b8,"e1 < e2",&local_21b9);
                std::__cxx11::string::string(local_2198,local_21b8);
                std::__cxx11::string::string((string *)(local_2220 + 0x40),(string *)&score_6);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_20e0,&local_2108,(text *)local_2198,
                           (text *)(local_2220 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_2220);
                std::__cxx11::string::string((string *)(local_2220 + 0x20),(string *)local_2220);
                lest::report(poVar1,&local_20e0,(text *)(local_2220 + 0x20));
                std::__cxx11::string::~string((string *)(local_2220 + 0x20));
                std::__cxx11::string::~string((string *)local_2220);
                lest::passing::~passing((passing *)&local_20e0);
                std::__cxx11::string::~string((string *)(local_2220 + 0x40));
                std::__cxx11::string::~string(local_2198);
                std::__cxx11::string::~string(local_21b8);
                std::allocator<char>::~allocator((allocator<char> *)&local_21b9);
                lest::location::~location(&local_2108);
                lest::location::~location(&local_2130);
                std::__cxx11::string::~string(local_2150);
                std::__cxx11::string::~string(local_2170);
                std::allocator<char>::~allocator((allocator<char> *)&local_2171);
              }
              lest::result::~result((result *)local_1eb0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x34;
          lest::ctx::~ctx((ctx *)local_1e40);
          lest__ctx_section_6._8_4_ =
               lest__ctx_section_6._8_4_ - (uint)(lest__ctx_section_6._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_8,&relop<char,_int,_long>::id1339,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_8);
      if (bVar2) {
        lest__ctx_section_7.once = true;
        lest__ctx_section_7._9_3_ = 0;
        for (lest__ctx_section_7._12_4_ = 0;
            (int)lest__ctx_section_7._12_4_ < (int)lest__ctx_section_7._8_4_;
            lest__ctx_section_7._12_4_ = lest__ctx_section_7._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_2368,"engaged    <  disengaged",(allocator *)&score_7.field_0x27);
          std::__cxx11::string::string(local_2348,local_2368);
          lest::ctx::ctx((ctx *)local_2328,lest_env,(text *)local_2348);
          std::__cxx11::string::~string(local_2348);
          std::__cxx11::string::~string(local_2368);
          std::allocator<char>::~allocator((allocator<char> *)&score_7.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2328), bVar2) {
            do {
              bVar2 = nonstd::optional_lite::operator<
                                ((optional<int> *)((long)&e2.contained + 4),
                                 (optional<char> *)&e1.field_0x2);
              local_23ca = (bool)(~bVar2 & 1);
              local_23c8 = (bool *)lest::expression_decomposer::operator<<(&local_23c9,&local_23ca);
              lest::expression_lhs::operator_cast_to_result
                        (&local_23c0,(expression_lhs *)&local_23c8);
              lest::result::result((result *)local_2398,&local_23c0);
              lest::result::~result(&local_23c0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2398);
              if (bVar2) {
                local_2549 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_24d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_24d9);
                std::__cxx11::string::string(local_24b8,local_24d8);
                lest::location::location(&local_2498,(text *)local_24b8,0x53b);
                lest::location::location(&local_2470,&local_2498);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2520,"!(e1 < d )",&local_2521);
                std::__cxx11::string::string(local_2500,local_2520);
                std::__cxx11::string::string(local_2548,(string *)&score_7);
                lest::failure::failure
                          (&local_2448,&local_2470,(text *)local_2500,(text *)local_2548);
                lest::failure::failure(pfVar3,&local_2448);
                local_2549 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_2658,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2659);
                std::__cxx11::string::string(local_2638,local_2658);
                lest::location::location(&local_2618,(text *)local_2638,0x53b);
                lest::location::location(&local_25f0,&local_2618);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_26a0,"!(e1 < d )",&local_26a1);
                std::__cxx11::string::string(local_2680,local_26a0);
                std::__cxx11::string::string((string *)(local_2708 + 0x40),(string *)&score_7);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_25c8,&local_25f0,(text *)local_2680,
                           (text *)(local_2708 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_2708);
                std::__cxx11::string::string((string *)(local_2708 + 0x20),(string *)local_2708);
                lest::report(poVar1,&local_25c8,(text *)(local_2708 + 0x20));
                std::__cxx11::string::~string((string *)(local_2708 + 0x20));
                std::__cxx11::string::~string((string *)local_2708);
                lest::passing::~passing((passing *)&local_25c8);
                std::__cxx11::string::~string((string *)(local_2708 + 0x40));
                std::__cxx11::string::~string(local_2680);
                std::__cxx11::string::~string(local_26a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_26a1);
                lest::location::~location(&local_25f0);
                lest::location::~location(&local_2618);
                std::__cxx11::string::~string(local_2638);
                std::__cxx11::string::~string(local_2658);
                std::allocator<char>::~allocator((allocator<char> *)&local_2659);
              }
              lest::result::~result((result *)local_2398);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x3b;
          lest::ctx::~ctx((ctx *)local_2328);
          lest__ctx_section_7._8_4_ =
               lest__ctx_section_7._8_4_ - (uint)(lest__ctx_section_7._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_9,&relop<char,_int,_long>::id1340,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_9);
      if (bVar2) {
        lest__ctx_section_8.once = true;
        lest__ctx_section_8._9_3_ = 0;
        for (lest__ctx_section_8._12_4_ = 0;
            (int)lest__ctx_section_8._12_4_ < (int)lest__ctx_section_8._8_4_;
            lest__ctx_section_8._12_4_ = lest__ctx_section_8._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_2850,"disengaged <  engaged",(allocator *)&score_8.field_0x27);
          std::__cxx11::string::string(local_2830,local_2850);
          lest::ctx::ctx((ctx *)local_2810,lest_env,(text *)local_2830);
          std::__cxx11::string::~string(local_2830);
          std::__cxx11::string::~string(local_2850);
          std::allocator<char>::~allocator((allocator<char> *)&score_8.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2810), bVar2) {
            do {
              local_28b0 = (optional<char> *)
                           lest::expression_decomposer::operator<<
                                     (&local_28b1,(optional<char> *)&e1.field_0x2);
              lest::expression_lhs<nonstd::optional_lite::optional<char>const&>::operator<
                        (&local_28a8,
                         (expression_lhs<nonstd::optional_lite::optional<char>const&> *)&local_28b0,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_2880,&local_28a8);
              lest::result::~result(&local_28a8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2880);
              if (bVar2) {
                local_2a31 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_29c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_29c1);
                std::__cxx11::string::string(local_29a0,local_29c0);
                lest::location::location(&local_2980,(text *)local_29a0,0x53c);
                lest::location::location(&local_2958,&local_2980);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2a08,"d < e2",&local_2a09);
                std::__cxx11::string::string(local_29e8,local_2a08);
                std::__cxx11::string::string(local_2a30,(string *)&score_8);
                lest::failure::failure
                          (&local_2930,&local_2958,(text *)local_29e8,(text *)local_2a30);
                lest::failure::failure(pfVar3,&local_2930);
                local_2a31 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_2b40,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2b41);
                std::__cxx11::string::string(local_2b20,local_2b40);
                lest::location::location(&local_2b00,(text *)local_2b20,0x53c);
                lest::location::location(&local_2ad8,&local_2b00);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2b88,"d < e2",&local_2b89);
                std::__cxx11::string::string(local_2b68,local_2b88);
                std::__cxx11::string::string((string *)(local_2bf0 + 0x40),(string *)&score_8);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2ab0,&local_2ad8,(text *)local_2b68,
                           (text *)(local_2bf0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_2bf0);
                std::__cxx11::string::string((string *)(local_2bf0 + 0x20),(string *)local_2bf0);
                lest::report(poVar1,&local_2ab0,(text *)(local_2bf0 + 0x20));
                std::__cxx11::string::~string((string *)(local_2bf0 + 0x20));
                std::__cxx11::string::~string((string *)local_2bf0);
                lest::passing::~passing((passing *)&local_2ab0);
                std::__cxx11::string::~string((string *)(local_2bf0 + 0x40));
                std::__cxx11::string::~string(local_2b68);
                std::__cxx11::string::~string(local_2b88);
                std::allocator<char>::~allocator((allocator<char> *)&local_2b89);
                lest::location::~location(&local_2ad8);
                lest::location::~location(&local_2b00);
                std::__cxx11::string::~string(local_2b20);
                std::__cxx11::string::~string(local_2b40);
                std::allocator<char>::~allocator((allocator<char> *)&local_2b41);
              }
              lest::result::~result((result *)local_2880);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x42;
          lest::ctx::~ctx((ctx *)local_2810);
          lest__ctx_section_8._8_4_ =
               lest__ctx_section_8._8_4_ - (uint)(lest__ctx_section_8._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_10,&relop<char,_int,_long>::id1342,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_10);
      if (bVar2) {
        lest__ctx_section_9.once = true;
        lest__ctx_section_9._9_3_ = 0;
        for (lest__ctx_section_9._12_4_ = 0;
            (int)lest__ctx_section_9._12_4_ < (int)lest__ctx_section_9._8_4_;
            lest__ctx_section_9._12_4_ = lest__ctx_section_9._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_2d38,"engaged    <= engaged",(allocator *)&score_9.field_0x27);
          std::__cxx11::string::string(local_2d18,local_2d38);
          lest::ctx::ctx((ctx *)local_2cf8,lest_env,(text *)local_2d18);
          std::__cxx11::string::~string(local_2d18);
          std::__cxx11::string::~string(local_2d38);
          std::allocator<char>::~allocator((allocator<char> *)&score_9.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_2cf8), bVar2) {
            do {
              local_2d98 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_2d99,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                        (&local_2d90,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_2d98,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_2d68,&local_2d90);
              lest::result::~result(&local_2d90);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_2d68);
              if (bVar2) {
                local_2f19 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_2ea8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_2ea9);
                std::__cxx11::string::string(local_2e88,local_2ea8);
                lest::location::location(&local_2e68,(text *)local_2e88,0x53e);
                lest::location::location(&local_2e40,&local_2e68);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_2ef0,"e1 <= e1",&local_2ef1);
                std::__cxx11::string::string(local_2ed0,local_2ef0);
                std::__cxx11::string::string(local_2f18,(string *)&score_9);
                lest::failure::failure
                          (&local_2e18,&local_2e40,(text *)local_2ed0,(text *)local_2f18);
                lest::failure::failure(pfVar3,&local_2e18);
                local_2f19 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3028,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3029);
                std::__cxx11::string::string(local_3008,local_3028);
                lest::location::location(&local_2fe8,(text *)local_3008,0x53e);
                lest::location::location(&local_2fc0,&local_2fe8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3070,"e1 <= e1",&local_3071);
                std::__cxx11::string::string(local_3050,local_3070);
                std::__cxx11::string::string((string *)(local_30d8 + 0x40),(string *)&score_9);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_2f98,&local_2fc0,(text *)local_3050,
                           (text *)(local_30d8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_30d8);
                std::__cxx11::string::string((string *)(local_30d8 + 0x20),(string *)local_30d8);
                lest::report(poVar1,&local_2f98,(text *)(local_30d8 + 0x20));
                std::__cxx11::string::~string((string *)(local_30d8 + 0x20));
                std::__cxx11::string::~string((string *)local_30d8);
                lest::passing::~passing((passing *)&local_2f98);
                std::__cxx11::string::~string((string *)(local_30d8 + 0x40));
                std::__cxx11::string::~string(local_3050);
                std::__cxx11::string::~string(local_3070);
                std::allocator<char>::~allocator((allocator<char> *)&local_3071);
                lest::location::~location(&local_2fc0);
                lest::location::~location(&local_2fe8);
                std::__cxx11::string::~string(local_3008);
                std::__cxx11::string::~string(local_3028);
                std::allocator<char>::~allocator((allocator<char> *)&local_3029);
              }
              lest::result::~result((result *)local_2d68);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x49;
          lest::ctx::~ctx((ctx *)local_2cf8);
          lest__ctx_section_9._8_4_ =
               lest__ctx_section_9._8_4_ - (uint)(lest__ctx_section_9._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_11,&relop<char,_int,_long>::id1343,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_11);
      if (bVar2) {
        lest__ctx_section_10.once = true;
        lest__ctx_section_10._9_3_ = 0;
        for (lest__ctx_section_10._12_4_ = 0;
            (int)lest__ctx_section_10._12_4_ < (int)lest__ctx_section_10._8_4_;
            lest__ctx_section_10._12_4_ = lest__ctx_section_10._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3220,"engaged    <= engaged",(allocator *)&score_10.field_0x27);
          std::__cxx11::string::string(local_3200,local_3220);
          lest::ctx::ctx((ctx *)local_31e0,lest_env,(text *)local_3200);
          std::__cxx11::string::~string(local_3200);
          std::__cxx11::string::~string(local_3220);
          std::allocator<char>::~allocator((allocator<char> *)&score_10.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_31e0), bVar2) {
            do {
              local_3280 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_3281,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                        (&local_3278,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_3280,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_3250,&local_3278);
              lest::result::~result(&local_3278);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3250);
              if (bVar2) {
                local_3401 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3390,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3391);
                std::__cxx11::string::string(local_3370,local_3390);
                lest::location::location(&local_3350,(text *)local_3370,0x53f);
                lest::location::location(&local_3328,&local_3350);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_33d8,"e1 <= e2",&local_33d9);
                std::__cxx11::string::string(local_33b8,local_33d8);
                std::__cxx11::string::string(local_3400,(string *)&score_10);
                lest::failure::failure
                          (&local_3300,&local_3328,(text *)local_33b8,(text *)local_3400);
                lest::failure::failure(pfVar3,&local_3300);
                local_3401 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3510,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3511);
                std::__cxx11::string::string(local_34f0,local_3510);
                lest::location::location(&local_34d0,(text *)local_34f0,0x53f);
                lest::location::location(&local_34a8,&local_34d0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3558,"e1 <= e2",&local_3559);
                std::__cxx11::string::string(local_3538,local_3558);
                std::__cxx11::string::string((string *)(local_35c0 + 0x40),(string *)&score_10);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3480,&local_34a8,(text *)local_3538,
                           (text *)(local_35c0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_35c0);
                std::__cxx11::string::string((string *)(local_35c0 + 0x20),(string *)local_35c0);
                lest::report(poVar1,&local_3480,(text *)(local_35c0 + 0x20));
                std::__cxx11::string::~string((string *)(local_35c0 + 0x20));
                std::__cxx11::string::~string((string *)local_35c0);
                lest::passing::~passing((passing *)&local_3480);
                std::__cxx11::string::~string((string *)(local_35c0 + 0x40));
                std::__cxx11::string::~string(local_3538);
                std::__cxx11::string::~string(local_3558);
                std::allocator<char>::~allocator((allocator<char> *)&local_3559);
                lest::location::~location(&local_34a8);
                lest::location::~location(&local_34d0);
                std::__cxx11::string::~string(local_34f0);
                std::__cxx11::string::~string(local_3510);
                std::allocator<char>::~allocator((allocator<char> *)&local_3511);
              }
              lest::result::~result((result *)local_3250);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x50;
          lest::ctx::~ctx((ctx *)local_31e0);
          lest__ctx_section_10._8_4_ =
               lest__ctx_section_10._8_4_ - (uint)(lest__ctx_section_10._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_12,&relop<char,_int,_long>::id1344,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_12);
      if (bVar2) {
        lest__ctx_section_11.once = true;
        lest__ctx_section_11._9_3_ = 0;
        for (lest__ctx_section_11._12_4_ = 0;
            (int)lest__ctx_section_11._12_4_ < (int)lest__ctx_section_11._8_4_;
            lest__ctx_section_11._12_4_ = lest__ctx_section_11._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3708,"engaged    <= disengaged",(allocator *)&score_11.field_0x27);
          std::__cxx11::string::string(local_36e8,local_3708);
          lest::ctx::ctx((ctx *)local_36c8,lest_env,(text *)local_36e8);
          std::__cxx11::string::~string(local_36e8);
          std::__cxx11::string::~string(local_3708);
          std::allocator<char>::~allocator((allocator<char> *)&score_11.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_36c8), bVar2) {
            do {
              bVar2 = nonstd::optional_lite::operator<=
                                ((optional<int> *)((long)&e2.contained + 4),
                                 (optional<char> *)&e1.field_0x2);
              local_376a = (bool)(~bVar2 & 1);
              local_3768 = (bool *)lest::expression_decomposer::operator<<(&local_3769,&local_376a);
              lest::expression_lhs::operator_cast_to_result
                        (&local_3760,(expression_lhs *)&local_3768);
              lest::result::result((result *)local_3738,&local_3760);
              lest::result::~result(&local_3760);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3738);
              if (bVar2) {
                local_38e9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3878,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3879);
                std::__cxx11::string::string(local_3858,local_3878);
                lest::location::location(&local_3838,(text *)local_3858,0x540);
                lest::location::location(&local_3810,&local_3838);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_38c0,"!(e1 <= d )",&local_38c1);
                std::__cxx11::string::string(local_38a0,local_38c0);
                std::__cxx11::string::string(local_38e8,(string *)&score_11);
                lest::failure::failure
                          (&local_37e8,&local_3810,(text *)local_38a0,(text *)local_38e8);
                lest::failure::failure(pfVar3,&local_37e8);
                local_38e9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_39f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_39f9);
                std::__cxx11::string::string(local_39d8,local_39f8);
                lest::location::location(&local_39b8,(text *)local_39d8,0x540);
                lest::location::location(&local_3990,&local_39b8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3a40,"!(e1 <= d )",&local_3a41);
                std::__cxx11::string::string(local_3a20,local_3a40);
                std::__cxx11::string::string((string *)(local_3aa8 + 0x40),(string *)&score_11);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3968,&local_3990,(text *)local_3a20,
                           (text *)(local_3aa8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_3aa8);
                std::__cxx11::string::string((string *)(local_3aa8 + 0x20),(string *)local_3aa8);
                lest::report(poVar1,&local_3968,(text *)(local_3aa8 + 0x20));
                std::__cxx11::string::~string((string *)(local_3aa8 + 0x20));
                std::__cxx11::string::~string((string *)local_3aa8);
                lest::passing::~passing((passing *)&local_3968);
                std::__cxx11::string::~string((string *)(local_3aa8 + 0x40));
                std::__cxx11::string::~string(local_3a20);
                std::__cxx11::string::~string(local_3a40);
                std::allocator<char>::~allocator((allocator<char> *)&local_3a41);
                lest::location::~location(&local_3990);
                lest::location::~location(&local_39b8);
                std::__cxx11::string::~string(local_39d8);
                std::__cxx11::string::~string(local_39f8);
                std::allocator<char>::~allocator((allocator<char> *)&local_39f9);
              }
              lest::result::~result((result *)local_3738);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x57;
          lest::ctx::~ctx((ctx *)local_36c8);
          lest__ctx_section_11._8_4_ =
               lest__ctx_section_11._8_4_ - (uint)(lest__ctx_section_11._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_13,&relop<char,_int,_long>::id1345,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_13);
      if (bVar2) {
        lest__ctx_section_12.once = true;
        lest__ctx_section_12._9_3_ = 0;
        for (lest__ctx_section_12._12_4_ = 0;
            (int)lest__ctx_section_12._12_4_ < (int)lest__ctx_section_12._8_4_;
            lest__ctx_section_12._12_4_ = lest__ctx_section_12._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_3bf0,"disengaged <= engaged",(allocator *)&score_12.field_0x27);
          std::__cxx11::string::string(local_3bd0,local_3bf0);
          lest::ctx::ctx((ctx *)local_3bb0,lest_env,(text *)local_3bd0);
          std::__cxx11::string::~string(local_3bd0);
          std::__cxx11::string::~string(local_3bf0);
          std::allocator<char>::~allocator((allocator<char> *)&score_12.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_3bb0), bVar2) {
            do {
              local_3c50 = (optional<char> *)
                           lest::expression_decomposer::operator<<
                                     (&local_3c51,(optional<char> *)&e1.field_0x2);
              lest::expression_lhs<nonstd::optional_lite::optional<char>const&>::operator<=
                        (&local_3c48,
                         (expression_lhs<nonstd::optional_lite::optional<char>const&> *)&local_3c50,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_3c20,&local_3c48);
              lest::result::~result(&local_3c48);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_3c20);
              if (bVar2) {
                local_3dd1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3d60,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3d61);
                std::__cxx11::string::string(local_3d40,local_3d60);
                lest::location::location(&local_3d20,(text *)local_3d40,0x541);
                lest::location::location(&local_3cf8,&local_3d20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3da8,"d <= e2",&local_3da9);
                std::__cxx11::string::string(local_3d88,local_3da8);
                std::__cxx11::string::string(local_3dd0,(string *)&score_12);
                lest::failure::failure
                          (&local_3cd0,&local_3cf8,(text *)local_3d88,(text *)local_3dd0);
                lest::failure::failure(pfVar3,&local_3cd0);
                local_3dd1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_3ee0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_3ee1);
                std::__cxx11::string::string(local_3ec0,local_3ee0);
                lest::location::location(&local_3ea0,(text *)local_3ec0,0x541);
                lest::location::location(&local_3e78,&local_3ea0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_3f28,"d <= e2",&local_3f29);
                std::__cxx11::string::string(local_3f08,local_3f28);
                std::__cxx11::string::string((string *)(local_3f90 + 0x40),(string *)&score_12);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_3e50,&local_3e78,(text *)local_3f08,
                           (text *)(local_3f90 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_3f90);
                std::__cxx11::string::string((string *)(local_3f90 + 0x20),(string *)local_3f90);
                lest::report(poVar1,&local_3e50,(text *)(local_3f90 + 0x20));
                std::__cxx11::string::~string((string *)(local_3f90 + 0x20));
                std::__cxx11::string::~string((string *)local_3f90);
                lest::passing::~passing((passing *)&local_3e50);
                std::__cxx11::string::~string((string *)(local_3f90 + 0x40));
                std::__cxx11::string::~string(local_3f08);
                std::__cxx11::string::~string(local_3f28);
                std::allocator<char>::~allocator((allocator<char> *)&local_3f29);
                lest::location::~location(&local_3e78);
                lest::location::~location(&local_3ea0);
                std::__cxx11::string::~string(local_3ec0);
                std::__cxx11::string::~string(local_3ee0);
                std::allocator<char>::~allocator((allocator<char> *)&local_3ee1);
              }
              lest::result::~result((result *)local_3c20);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x5e;
          lest::ctx::~ctx((ctx *)local_3bb0);
          lest__ctx_section_12._8_4_ =
               lest__ctx_section_12._8_4_ - (uint)(lest__ctx_section_12._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_14,&relop<char,_int,_long>::id1347,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_14);
      if (bVar2) {
        lest__ctx_section_13.once = true;
        lest__ctx_section_13._9_3_ = 0;
        for (lest__ctx_section_13._12_4_ = 0;
            (int)lest__ctx_section_13._12_4_ < (int)lest__ctx_section_13._8_4_;
            lest__ctx_section_13._12_4_ = lest__ctx_section_13._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_40d8,"engaged    >  engaged",(allocator *)&score_13.field_0x27);
          std::__cxx11::string::string(local_40b8,local_40d8);
          lest::ctx::ctx((ctx *)local_4098,lest_env,(text *)local_40b8);
          std::__cxx11::string::~string(local_40b8);
          std::__cxx11::string::~string(local_40d8);
          std::allocator<char>::~allocator((allocator<char> *)&score_13.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4098), bVar2) {
            do {
              local_4138 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_4139,(optional<long> *)local_a0);
              lest::expression_lhs<nonstd::optional_lite::optional<long>const&>::operator>
                        (&local_4130,
                         (expression_lhs<nonstd::optional_lite::optional<long>const&> *)&local_4138,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_4108,&local_4130);
              lest::result::~result(&local_4130);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4108);
              if (bVar2) {
                local_42b9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_4248,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4249);
                std::__cxx11::string::string(local_4228,local_4248);
                lest::location::location(&local_4208,(text *)local_4228,0x543);
                lest::location::location(&local_41e0,&local_4208);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4290,"e2 > e1",&local_4291);
                std::__cxx11::string::string(local_4270,local_4290);
                std::__cxx11::string::string(local_42b8,(string *)&score_13);
                lest::failure::failure
                          (&local_41b8,&local_41e0,(text *)local_4270,(text *)local_42b8);
                lest::failure::failure(pfVar3,&local_41b8);
                local_42b9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_43c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_43c9);
                std::__cxx11::string::string(local_43a8,local_43c8);
                lest::location::location(&local_4388,(text *)local_43a8,0x543);
                lest::location::location(&local_4360,&local_4388);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4410,"e2 > e1",&local_4411);
                std::__cxx11::string::string(local_43f0,local_4410);
                std::__cxx11::string::string((string *)(local_4478 + 0x40),(string *)&score_13);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4338,&local_4360,(text *)local_43f0,
                           (text *)(local_4478 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_4478);
                std::__cxx11::string::string((string *)(local_4478 + 0x20),(string *)local_4478);
                lest::report(poVar1,&local_4338,(text *)(local_4478 + 0x20));
                std::__cxx11::string::~string((string *)(local_4478 + 0x20));
                std::__cxx11::string::~string((string *)local_4478);
                lest::passing::~passing((passing *)&local_4338);
                std::__cxx11::string::~string((string *)(local_4478 + 0x40));
                std::__cxx11::string::~string(local_43f0);
                std::__cxx11::string::~string(local_4410);
                std::allocator<char>::~allocator((allocator<char> *)&local_4411);
                lest::location::~location(&local_4360);
                lest::location::~location(&local_4388);
                std::__cxx11::string::~string(local_43a8);
                std::__cxx11::string::~string(local_43c8);
                std::allocator<char>::~allocator((allocator<char> *)&local_43c9);
              }
              lest::result::~result((result *)local_4108);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x65;
          lest::ctx::~ctx((ctx *)local_4098);
          lest__ctx_section_13._8_4_ =
               lest__ctx_section_13._8_4_ - (uint)(lest__ctx_section_13._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_15,&relop<char,_int,_long>::id1348,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_15);
      if (bVar2) {
        lest__ctx_section_14.once = true;
        lest__ctx_section_14._9_3_ = 0;
        for (lest__ctx_section_14._12_4_ = 0;
            (int)lest__ctx_section_14._12_4_ < (int)lest__ctx_section_14._8_4_;
            lest__ctx_section_14._12_4_ = lest__ctx_section_14._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_45c0,"engaged    >  disengaged",(allocator *)&score_14.field_0x27);
          std::__cxx11::string::string(local_45a0,local_45c0);
          lest::ctx::ctx((ctx *)local_4580,lest_env,(text *)local_45a0);
          std::__cxx11::string::~string(local_45a0);
          std::__cxx11::string::~string(local_45c0);
          std::allocator<char>::~allocator((allocator<char> *)&score_14.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4580), bVar2) {
            do {
              local_4620 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_4621,(optional<long> *)local_a0);
              lest::expression_lhs<nonstd::optional_lite::optional<long>const&>::operator>
                        (&local_4618,
                         (expression_lhs<nonstd::optional_lite::optional<long>const&> *)&local_4620,
                         (optional<char> *)&e1.field_0x2);
              lest::result::result((result *)local_45f0,&local_4618);
              lest::result::~result(&local_4618);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_45f0);
              if (bVar2) {
                local_47a1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_4730,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4731);
                std::__cxx11::string::string(local_4710,local_4730);
                lest::location::location(&local_46f0,(text *)local_4710,0x544);
                lest::location::location(&local_46c8,&local_46f0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4778,"e2 > d",&local_4779);
                std::__cxx11::string::string(local_4758,local_4778);
                std::__cxx11::string::string(local_47a0,(string *)&score_14);
                lest::failure::failure
                          (&local_46a0,&local_46c8,(text *)local_4758,(text *)local_47a0);
                lest::failure::failure(pfVar3,&local_46a0);
                local_47a1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_48b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_48b1);
                std::__cxx11::string::string(local_4890,local_48b0);
                lest::location::location(&local_4870,(text *)local_4890,0x544);
                lest::location::location(&local_4848,&local_4870);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_48f8,"e2 > d",&local_48f9);
                std::__cxx11::string::string(local_48d8,local_48f8);
                std::__cxx11::string::string((string *)(local_4960 + 0x40),(string *)&score_14);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4820,&local_4848,(text *)local_48d8,
                           (text *)(local_4960 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_4960);
                std::__cxx11::string::string((string *)(local_4960 + 0x20),(string *)local_4960);
                lest::report(poVar1,&local_4820,(text *)(local_4960 + 0x20));
                std::__cxx11::string::~string((string *)(local_4960 + 0x20));
                std::__cxx11::string::~string((string *)local_4960);
                lest::passing::~passing((passing *)&local_4820);
                std::__cxx11::string::~string((string *)(local_4960 + 0x40));
                std::__cxx11::string::~string(local_48d8);
                std::__cxx11::string::~string(local_48f8);
                std::allocator<char>::~allocator((allocator<char> *)&local_48f9);
                lest::location::~location(&local_4848);
                lest::location::~location(&local_4870);
                std::__cxx11::string::~string(local_4890);
                std::__cxx11::string::~string(local_48b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_48b1);
              }
              lest::result::~result((result *)local_45f0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x6c;
          lest::ctx::~ctx((ctx *)local_4580);
          lest__ctx_section_14._8_4_ =
               lest__ctx_section_14._8_4_ - (uint)(lest__ctx_section_14._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_16,&relop<char,_int,_long>::id1349,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_16);
      if (bVar2) {
        lest__ctx_section_15.once = true;
        lest__ctx_section_15._9_3_ = 0;
        for (lest__ctx_section_15._12_4_ = 0;
            (int)lest__ctx_section_15._12_4_ < (int)lest__ctx_section_15._8_4_;
            lest__ctx_section_15._12_4_ = lest__ctx_section_15._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4aa8,"disengaged >  engaged",(allocator *)&score_15.field_0x27);
          std::__cxx11::string::string(local_4a88,local_4aa8);
          lest::ctx::ctx((ctx *)local_4a68,lest_env,(text *)local_4a88);
          std::__cxx11::string::~string(local_4a88);
          std::__cxx11::string::~string(local_4aa8);
          std::allocator<char>::~allocator((allocator<char> *)&score_15.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4a68), bVar2) {
            do {
              bVar2 = nonstd::optional_lite::operator>
                                ((optional<char> *)&e1.field_0x2,
                                 (optional<int> *)((long)&e2.contained + 4));
              local_4b0a = (bool)(~bVar2 & 1);
              local_4b08 = (bool *)lest::expression_decomposer::operator<<(&local_4b09,&local_4b0a);
              lest::expression_lhs::operator_cast_to_result
                        (&local_4b00,(expression_lhs *)&local_4b08);
              lest::result::result((result *)local_4ad8,&local_4b00);
              lest::result::~result(&local_4b00);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4ad8);
              if (bVar2) {
                local_4c89 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_4c18,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4c19);
                std::__cxx11::string::string(local_4bf8,local_4c18);
                lest::location::location(&local_4bd8,(text *)local_4bf8,0x545);
                lest::location::location(&local_4bb0,&local_4bd8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4c60,"!(d > e1)",&local_4c61);
                std::__cxx11::string::string(local_4c40,local_4c60);
                std::__cxx11::string::string(local_4c88,(string *)&score_15);
                lest::failure::failure
                          (&local_4b88,&local_4bb0,(text *)local_4c40,(text *)local_4c88);
                lest::failure::failure(pfVar3,&local_4b88);
                local_4c89 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_4d98,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_4d99);
                std::__cxx11::string::string(local_4d78,local_4d98);
                lest::location::location(&local_4d58,(text *)local_4d78,0x545);
                lest::location::location(&local_4d30,&local_4d58);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_4de0,"!(d > e1)",&local_4de1);
                std::__cxx11::string::string(local_4dc0,local_4de0);
                std::__cxx11::string::string((string *)(local_4e48 + 0x40),(string *)&score_15);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_4d08,&local_4d30,(text *)local_4dc0,
                           (text *)(local_4e48 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_4e48);
                std::__cxx11::string::string((string *)(local_4e48 + 0x20),(string *)local_4e48);
                lest::report(poVar1,&local_4d08,(text *)(local_4e48 + 0x20));
                std::__cxx11::string::~string((string *)(local_4e48 + 0x20));
                std::__cxx11::string::~string((string *)local_4e48);
                lest::passing::~passing((passing *)&local_4d08);
                std::__cxx11::string::~string((string *)(local_4e48 + 0x40));
                std::__cxx11::string::~string(local_4dc0);
                std::__cxx11::string::~string(local_4de0);
                std::allocator<char>::~allocator((allocator<char> *)&local_4de1);
                lest::location::~location(&local_4d30);
                lest::location::~location(&local_4d58);
                std::__cxx11::string::~string(local_4d78);
                std::__cxx11::string::~string(local_4d98);
                std::allocator<char>::~allocator((allocator<char> *)&local_4d99);
              }
              lest::result::~result((result *)local_4ad8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x73;
          lest::ctx::~ctx((ctx *)local_4a68);
          lest__ctx_section_15._8_4_ =
               lest__ctx_section_15._8_4_ - (uint)(lest__ctx_section_15._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_17,&relop<char,_int,_long>::id1351,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_17);
      if (bVar2) {
        lest__ctx_section_16.once = true;
        lest__ctx_section_16._9_3_ = 0;
        for (lest__ctx_section_16._12_4_ = 0;
            (int)lest__ctx_section_16._12_4_ < (int)lest__ctx_section_16._8_4_;
            lest__ctx_section_16._12_4_ = lest__ctx_section_16._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_4f90,"engaged    >= engaged",(allocator *)&score_16.field_0x27);
          std::__cxx11::string::string(local_4f70,local_4f90);
          lest::ctx::ctx((ctx *)local_4f50,lest_env,(text *)local_4f70);
          std::__cxx11::string::~string(local_4f70);
          std::__cxx11::string::~string(local_4f90);
          std::allocator<char>::~allocator((allocator<char> *)&score_16.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_4f50), bVar2) {
            do {
              local_4ff0 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_4ff1,(optional<int> *)((long)&e2.contained + 4));
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator>=
                        (&local_4fe8,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_4ff0,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_4fc0,&local_4fe8);
              lest::result::~result(&local_4fe8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_4fc0);
              if (bVar2) {
                local_5171 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5100,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5101);
                std::__cxx11::string::string(local_50e0,local_5100);
                lest::location::location(&local_50c0,(text *)local_50e0,0x547);
                lest::location::location(&local_5098,&local_50c0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5148,"e1 >= e1",&local_5149);
                std::__cxx11::string::string(local_5128,local_5148);
                std::__cxx11::string::string(local_5170,(string *)&score_16);
                lest::failure::failure
                          (&local_5070,&local_5098,(text *)local_5128,(text *)local_5170);
                lest::failure::failure(pfVar3,&local_5070);
                local_5171 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5280,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5281);
                std::__cxx11::string::string(local_5260,local_5280);
                lest::location::location(&local_5240,(text *)local_5260,0x547);
                lest::location::location(&local_5218,&local_5240);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_52c8,"e1 >= e1",&local_52c9);
                std::__cxx11::string::string(local_52a8,local_52c8);
                std::__cxx11::string::string((string *)(local_5330 + 0x40),(string *)&score_16);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_51f0,&local_5218,(text *)local_52a8,
                           (text *)(local_5330 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_5330);
                std::__cxx11::string::string((string *)(local_5330 + 0x20),(string *)local_5330);
                lest::report(poVar1,&local_51f0,(text *)(local_5330 + 0x20));
                std::__cxx11::string::~string((string *)(local_5330 + 0x20));
                std::__cxx11::string::~string((string *)local_5330);
                lest::passing::~passing((passing *)&local_51f0);
                std::__cxx11::string::~string((string *)(local_5330 + 0x40));
                std::__cxx11::string::~string(local_52a8);
                std::__cxx11::string::~string(local_52c8);
                std::allocator<char>::~allocator((allocator<char> *)&local_52c9);
                lest::location::~location(&local_5218);
                lest::location::~location(&local_5240);
                std::__cxx11::string::~string(local_5260);
                std::__cxx11::string::~string(local_5280);
                std::allocator<char>::~allocator((allocator<char> *)&local_5281);
              }
              lest::result::~result((result *)local_4fc0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x7a;
          lest::ctx::~ctx((ctx *)local_4f50);
          lest__ctx_section_16._8_4_ =
               lest__ctx_section_16._8_4_ - (uint)(lest__ctx_section_16._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_18,&relop<char,_int,_long>::id1352,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_18);
      if (bVar2) {
        lest__ctx_section_17.once = true;
        lest__ctx_section_17._9_3_ = 0;
        for (lest__ctx_section_17._12_4_ = 0;
            (int)lest__ctx_section_17._12_4_ < (int)lest__ctx_section_17._8_4_;
            lest__ctx_section_17._12_4_ = lest__ctx_section_17._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5478,"engaged    >= engaged",(allocator *)&score_17.field_0x27);
          std::__cxx11::string::string(local_5458,local_5478);
          lest::ctx::ctx((ctx *)local_5438,lest_env,(text *)local_5458);
          std::__cxx11::string::~string(local_5458);
          std::__cxx11::string::~string(local_5478);
          std::allocator<char>::~allocator((allocator<char> *)&score_17.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5438), bVar2) {
            do {
              local_54d8 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_54d9,(optional<long> *)local_a0);
              lest::expression_lhs<nonstd::optional_lite::optional<long>const&>::operator>=
                        (&local_54d0,
                         (expression_lhs<nonstd::optional_lite::optional<long>const&> *)&local_54d8,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_54a8,&local_54d0);
              lest::result::~result(&local_54d0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_54a8);
              if (bVar2) {
                local_5659 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_55e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_55e9);
                std::__cxx11::string::string(local_55c8,local_55e8);
                lest::location::location(&local_55a8,(text *)local_55c8,0x548);
                lest::location::location(&local_5580,&local_55a8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5630,"e2 >= e1",&local_5631);
                std::__cxx11::string::string(local_5610,local_5630);
                std::__cxx11::string::string(local_5658,(string *)&score_17);
                lest::failure::failure
                          (&local_5558,&local_5580,(text *)local_5610,(text *)local_5658);
                lest::failure::failure(pfVar3,&local_5558);
                local_5659 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5768,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5769);
                std::__cxx11::string::string(local_5748,local_5768);
                lest::location::location(&local_5728,(text *)local_5748,0x548);
                lest::location::location(&local_5700,&local_5728);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_57b0,"e2 >= e1",&local_57b1);
                std::__cxx11::string::string(local_5790,local_57b0);
                std::__cxx11::string::string((string *)(local_5818 + 0x40),(string *)&score_17);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_56d8,&local_5700,(text *)local_5790,
                           (text *)(local_5818 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_5818);
                std::__cxx11::string::string((string *)(local_5818 + 0x20),(string *)local_5818);
                lest::report(poVar1,&local_56d8,(text *)(local_5818 + 0x20));
                std::__cxx11::string::~string((string *)(local_5818 + 0x20));
                std::__cxx11::string::~string((string *)local_5818);
                lest::passing::~passing((passing *)&local_56d8);
                std::__cxx11::string::~string((string *)(local_5818 + 0x40));
                std::__cxx11::string::~string(local_5790);
                std::__cxx11::string::~string(local_57b0);
                std::allocator<char>::~allocator((allocator<char> *)&local_57b1);
                lest::location::~location(&local_5700);
                lest::location::~location(&local_5728);
                std::__cxx11::string::~string(local_5748);
                std::__cxx11::string::~string(local_5768);
                std::allocator<char>::~allocator((allocator<char> *)&local_5769);
              }
              lest::result::~result((result *)local_54a8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x81;
          lest::ctx::~ctx((ctx *)local_5438);
          lest__ctx_section_17._8_4_ =
               lest__ctx_section_17._8_4_ - (uint)(lest__ctx_section_17._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_19,&relop<char,_int,_long>::id1353,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_19);
      if (bVar2) {
        lest__ctx_section_18.once = true;
        lest__ctx_section_18._9_3_ = 0;
        for (lest__ctx_section_18._12_4_ = 0;
            (int)lest__ctx_section_18._12_4_ < (int)lest__ctx_section_18._8_4_;
            lest__ctx_section_18._12_4_ = lest__ctx_section_18._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5960,"engaged    >= disengaged",(allocator *)&score_18.field_0x27);
          std::__cxx11::string::string(local_5940,local_5960);
          lest::ctx::ctx((ctx *)local_5920,lest_env,(text *)local_5940);
          std::__cxx11::string::~string(local_5940);
          std::__cxx11::string::~string(local_5960);
          std::allocator<char>::~allocator((allocator<char> *)&score_18.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5920), bVar2) {
            do {
              local_59c0 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_59c1,(optional<long> *)local_a0);
              lest::expression_lhs<nonstd::optional_lite::optional<long>const&>::operator>=
                        (&local_59b8,
                         (expression_lhs<nonstd::optional_lite::optional<long>const&> *)&local_59c0,
                         (optional<char> *)&e1.field_0x2);
              lest::result::result((result *)local_5990,&local_59b8);
              lest::result::~result(&local_59b8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5990);
              if (bVar2) {
                local_5b41 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5ad0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5ad1);
                std::__cxx11::string::string(local_5ab0,local_5ad0);
                lest::location::location(&local_5a90,(text *)local_5ab0,0x549);
                lest::location::location(&local_5a68,&local_5a90);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5b18,"e2 >= d",&local_5b19);
                std::__cxx11::string::string(local_5af8,local_5b18);
                std::__cxx11::string::string(local_5b40,(string *)&score_18);
                lest::failure::failure
                          (&local_5a40,&local_5a68,(text *)local_5af8,(text *)local_5b40);
                lest::failure::failure(pfVar3,&local_5a40);
                local_5b41 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5c50,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5c51);
                std::__cxx11::string::string(local_5c30,local_5c50);
                lest::location::location(&local_5c10,(text *)local_5c30,0x549);
                lest::location::location(&local_5be8,&local_5c10);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_5c98,"e2 >= d",&local_5c99);
                std::__cxx11::string::string(local_5c78,local_5c98);
                std::__cxx11::string::string((string *)(local_5d00 + 0x40),(string *)&score_18);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_5bc0,&local_5be8,(text *)local_5c78,
                           (text *)(local_5d00 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_5d00);
                std::__cxx11::string::string((string *)(local_5d00 + 0x20),(string *)local_5d00);
                lest::report(poVar1,&local_5bc0,(text *)(local_5d00 + 0x20));
                std::__cxx11::string::~string((string *)(local_5d00 + 0x20));
                std::__cxx11::string::~string((string *)local_5d00);
                lest::passing::~passing((passing *)&local_5bc0);
                std::__cxx11::string::~string((string *)(local_5d00 + 0x40));
                std::__cxx11::string::~string(local_5c78);
                std::__cxx11::string::~string(local_5c98);
                std::allocator<char>::~allocator((allocator<char> *)&local_5c99);
                lest::location::~location(&local_5be8);
                lest::location::~location(&local_5c10);
                std::__cxx11::string::~string(local_5c30);
                std::__cxx11::string::~string(local_5c50);
                std::allocator<char>::~allocator((allocator<char> *)&local_5c51);
              }
              lest::result::~result((result *)local_5990);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x88;
          lest::ctx::~ctx((ctx *)local_5920);
          lest__ctx_section_18._8_4_ =
               lest__ctx_section_18._8_4_ - (uint)(lest__ctx_section_18._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_20,&relop<char,_int,_long>::id1354,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_20);
      if (bVar2) {
        lest__ctx_section_19.once = true;
        lest__ctx_section_19._9_3_ = 0;
        for (lest__ctx_section_19._12_4_ = 0;
            (int)lest__ctx_section_19._12_4_ < (int)lest__ctx_section_19._8_4_;
            lest__ctx_section_19._12_4_ = lest__ctx_section_19._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_5e48,"disengaged >= engaged",(allocator *)&score_19.field_0x27);
          std::__cxx11::string::string(local_5e28,local_5e48);
          lest::ctx::ctx((ctx *)local_5e08,lest_env,(text *)local_5e28);
          std::__cxx11::string::~string(local_5e28);
          std::__cxx11::string::~string(local_5e48);
          std::allocator<char>::~allocator((allocator<char> *)&score_19.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_5e08), bVar2) {
            do {
              bVar2 = nonstd::optional_lite::operator>=
                                ((optional<char> *)&e1.field_0x2,
                                 (optional<int> *)((long)&e2.contained + 4));
              local_5eaa = (bool)(~bVar2 & 1);
              local_5ea8 = (bool *)lest::expression_decomposer::operator<<(&local_5ea9,&local_5eaa);
              lest::expression_lhs::operator_cast_to_result
                        (&local_5ea0,(expression_lhs *)&local_5ea8);
              lest::result::result((result *)local_5e78,&local_5ea0);
              lest::result::~result(&local_5ea0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_5e78);
              if (bVar2) {
                local_6029 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_5fb8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_5fb9);
                std::__cxx11::string::string(local_5f98,local_5fb8);
                lest::location::location(&local_5f78,(text *)local_5f98,0x54a);
                lest::location::location(&local_5f50,&local_5f78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_6000,"!(d >= e1)",&local_6001);
                std::__cxx11::string::string(local_5fe0,local_6000);
                std::__cxx11::string::string(local_6028,(string *)&score_19);
                lest::failure::failure
                          (&local_5f28,&local_5f50,(text *)local_5fe0,(text *)local_6028);
                lest::failure::failure(pfVar3,&local_5f28);
                local_6029 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6138,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6139);
                std::__cxx11::string::string(local_6118,local_6138);
                lest::location::location(&local_60f8,(text *)local_6118,0x54a);
                lest::location::location(&local_60d0,&local_60f8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_6180,"!(d >= e1)",&local_6181);
                std::__cxx11::string::string(local_6160,local_6180);
                std::__cxx11::string::string((string *)(local_61e8 + 0x40),(string *)&score_19);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_60a8,&local_60d0,(text *)local_6160,
                           (text *)(local_61e8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_61e8);
                std::__cxx11::string::string((string *)(local_61e8 + 0x20),(string *)local_61e8);
                lest::report(poVar1,&local_60a8,(text *)(local_61e8 + 0x20));
                std::__cxx11::string::~string((string *)(local_61e8 + 0x20));
                std::__cxx11::string::~string((string *)local_61e8);
                lest::passing::~passing((passing *)&local_60a8);
                std::__cxx11::string::~string((string *)(local_61e8 + 0x40));
                std::__cxx11::string::~string(local_6160);
                std::__cxx11::string::~string(local_6180);
                std::allocator<char>::~allocator((allocator<char> *)&local_6181);
                lest::location::~location(&local_60d0);
                lest::location::~location(&local_60f8);
                std::__cxx11::string::~string(local_6118);
                std::__cxx11::string::~string(local_6138);
                std::allocator<char>::~allocator((allocator<char> *)&local_6139);
              }
              lest::result::~result((result *)local_5e78);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x8f;
          lest::ctx::~ctx((ctx *)local_5e08);
          lest__ctx_section_19._8_4_ =
               lest__ctx_section_19._8_4_ - (uint)(lest__ctx_section_19._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_21,&relop<char,_int,_long>::id1356,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_21);
      if (bVar2) {
        lest__ctx_section_20.once = true;
        lest__ctx_section_20._9_3_ = 0;
        for (lest__ctx_section_20._12_4_ = 0;
            (int)lest__ctx_section_20._12_4_ < (int)lest__ctx_section_20._8_4_;
            lest__ctx_section_20._12_4_ = lest__ctx_section_20._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6330,"disengaged == nullopt",(allocator *)&score_20.field_0x27);
          std::__cxx11::string::string(local_6310,local_6330);
          lest::ctx::ctx((ctx *)local_62f0,lest_env,(text *)local_6310);
          std::__cxx11::string::~string(local_6310);
          std::__cxx11::string::~string(local_6330);
          std::allocator<char>::~allocator((allocator<char> *)&score_20.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_62f0), bVar2) {
            do {
              local_6392 = nonstd::optional_lite::operator==(&e1.field_0x2);
              local_6390 = (bool *)lest::expression_decomposer::operator<<(&local_6391,&local_6392);
              lest::expression_lhs::operator_cast_to_result
                        (&local_6388,(expression_lhs *)&local_6390);
              lest::result::result((result *)local_6360,&local_6388);
              lest::result::~result(&local_6388);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6360);
              if (bVar2) {
                local_6511 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_64a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_64a1);
                std::__cxx11::string::string(local_6480,local_64a0);
                lest::location::location(&local_6460,(text *)local_6480,0x54c);
                lest::location::location(&local_6438,&local_6460);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_64e8,"(d == nullopt)",&local_64e9);
                std::__cxx11::string::string(local_64c8,local_64e8);
                std::__cxx11::string::string(local_6510,(string *)&score_20);
                lest::failure::failure
                          (&local_6410,&local_6438,(text *)local_64c8,(text *)local_6510);
                lest::failure::failure(pfVar3,&local_6410);
                local_6511 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6620,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6621);
                std::__cxx11::string::string(local_6600,local_6620);
                lest::location::location(&local_65e0,(text *)local_6600,0x54c);
                lest::location::location(&local_65b8,&local_65e0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_6668,"(d == nullopt)",&local_6669);
                std::__cxx11::string::string(local_6648,local_6668);
                std::__cxx11::string::string((string *)(local_66d0 + 0x40),(string *)&score_20);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6590,&local_65b8,(text *)local_6648,
                           (text *)(local_66d0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_66d0);
                std::__cxx11::string::string((string *)(local_66d0 + 0x20),(string *)local_66d0);
                lest::report(poVar1,&local_6590,(text *)(local_66d0 + 0x20));
                std::__cxx11::string::~string((string *)(local_66d0 + 0x20));
                std::__cxx11::string::~string((string *)local_66d0);
                lest::passing::~passing((passing *)&local_6590);
                std::__cxx11::string::~string((string *)(local_66d0 + 0x40));
                std::__cxx11::string::~string(local_6648);
                std::__cxx11::string::~string(local_6668);
                std::allocator<char>::~allocator((allocator<char> *)&local_6669);
                lest::location::~location(&local_65b8);
                lest::location::~location(&local_65e0);
                std::__cxx11::string::~string(local_6600);
                std::__cxx11::string::~string(local_6620);
                std::allocator<char>::~allocator((allocator<char> *)&local_6621);
              }
              lest::result::~result((result *)local_6360);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x96;
          lest::ctx::~ctx((ctx *)local_62f0);
          lest__ctx_section_20._8_4_ =
               lest__ctx_section_20._8_4_ - (uint)(lest__ctx_section_20._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_22,&relop<char,_int,_long>::id1357,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_22);
      if (bVar2) {
        lest__ctx_section_21.once = true;
        lest__ctx_section_21._9_3_ = 0;
        for (lest__ctx_section_21._12_4_ = 0;
            (int)lest__ctx_section_21._12_4_ < (int)lest__ctx_section_21._8_4_;
            lest__ctx_section_21._12_4_ = lest__ctx_section_21._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6818,"nullopt    == disengaged",(allocator *)&score_21.field_0x27);
          std::__cxx11::string::string(local_67f8,local_6818);
          lest::ctx::ctx((ctx *)local_67d8,lest_env,(text *)local_67f8);
          std::__cxx11::string::~string(local_67f8);
          std::__cxx11::string::~string(local_6818);
          std::allocator<char>::~allocator((allocator<char> *)&score_21.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_67d8), bVar2) {
            do {
              local_687a = nonstd::optional_lite::operator==(&e1.field_0x2);
              local_6878 = (bool *)lest::expression_decomposer::operator<<(&local_6879,&local_687a);
              lest::expression_lhs::operator_cast_to_result
                        (&local_6870,(expression_lhs *)&local_6878);
              lest::result::result((result *)local_6848,&local_6870);
              lest::result::~result(&local_6870);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6848);
              if (bVar2) {
                local_69f9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6988,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6989);
                std::__cxx11::string::string(local_6968,local_6988);
                lest::location::location(&local_6948,(text *)local_6968,0x54d);
                lest::location::location(&local_6920,&local_6948);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_69d0,"(nullopt == d )",&local_69d1);
                std::__cxx11::string::string(local_69b0,local_69d0);
                std::__cxx11::string::string(local_69f8,(string *)&score_21);
                lest::failure::failure
                          (&local_68f8,&local_6920,(text *)local_69b0,(text *)local_69f8);
                lest::failure::failure(pfVar3,&local_68f8);
                local_69f9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6b08,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6b09);
                std::__cxx11::string::string(local_6ae8,local_6b08);
                lest::location::location(&local_6ac8,(text *)local_6ae8,0x54d);
                lest::location::location(&local_6aa0,&local_6ac8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_6b50,"(nullopt == d )",&local_6b51);
                std::__cxx11::string::string(local_6b30,local_6b50);
                std::__cxx11::string::string((string *)(local_6bb8 + 0x40),(string *)&score_21);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6a78,&local_6aa0,(text *)local_6b30,
                           (text *)(local_6bb8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_6bb8);
                std::__cxx11::string::string((string *)(local_6bb8 + 0x20),(string *)local_6bb8);
                lest::report(poVar1,&local_6a78,(text *)(local_6bb8 + 0x20));
                std::__cxx11::string::~string((string *)(local_6bb8 + 0x20));
                std::__cxx11::string::~string((string *)local_6bb8);
                lest::passing::~passing((passing *)&local_6a78);
                std::__cxx11::string::~string((string *)(local_6bb8 + 0x40));
                std::__cxx11::string::~string(local_6b30);
                std::__cxx11::string::~string(local_6b50);
                std::allocator<char>::~allocator((allocator<char> *)&local_6b51);
                lest::location::~location(&local_6aa0);
                lest::location::~location(&local_6ac8);
                std::__cxx11::string::~string(local_6ae8);
                std::__cxx11::string::~string(local_6b08);
                std::allocator<char>::~allocator((allocator<char> *)&local_6b09);
              }
              lest::result::~result((result *)local_6848);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x9d;
          lest::ctx::~ctx((ctx *)local_67d8);
          lest__ctx_section_21._8_4_ =
               lest__ctx_section_21._8_4_ - (uint)(lest__ctx_section_21._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_23,&relop<char,_int,_long>::id1358,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_23);
      if (bVar2) {
        lest__ctx_section_22.once = true;
        lest__ctx_section_22._9_3_ = 0;
        for (lest__ctx_section_22._12_4_ = 0;
            (int)lest__ctx_section_22._12_4_ < (int)lest__ctx_section_22._8_4_;
            lest__ctx_section_22._12_4_ = lest__ctx_section_22._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_6d00,"engaged    == nullopt",(allocator *)&score_22.field_0x27);
          std::__cxx11::string::string(local_6ce0,local_6d00);
          lest::ctx::ctx((ctx *)local_6cc0,lest_env,(text *)local_6ce0);
          std::__cxx11::string::~string(local_6ce0);
          std::__cxx11::string::~string(local_6d00);
          std::allocator<char>::~allocator((allocator<char> *)&score_22.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_6cc0), bVar2) {
            do {
              local_6d62 = nonstd::optional_lite::operator!=
                                     ((undefined1 *)((long)&e2.contained + 4));
              local_6d60 = (bool *)lest::expression_decomposer::operator<<(&local_6d61,&local_6d62);
              lest::expression_lhs::operator_cast_to_result
                        (&local_6d58,(expression_lhs *)&local_6d60);
              lest::result::result((result *)local_6d30,&local_6d58);
              lest::result::~result(&local_6d58);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_6d30);
              if (bVar2) {
                local_6ee1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6e70,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6e71);
                std::__cxx11::string::string(local_6e50,local_6e70);
                lest::location::location(&local_6e30,(text *)local_6e50,0x54e);
                lest::location::location(&local_6e08,&local_6e30);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_6eb8,"(e1 != nullopt)",&local_6eb9);
                std::__cxx11::string::string(local_6e98,local_6eb8);
                std::__cxx11::string::string(local_6ee0,(string *)&score_22);
                lest::failure::failure
                          (&local_6de0,&local_6e08,(text *)local_6e98,(text *)local_6ee0);
                lest::failure::failure(pfVar3,&local_6de0);
                local_6ee1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_6ff0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_6ff1);
                std::__cxx11::string::string(local_6fd0,local_6ff0);
                lest::location::location(&local_6fb0,(text *)local_6fd0,0x54e);
                lest::location::location(&local_6f88,&local_6fb0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7038,"(e1 != nullopt)",&local_7039);
                std::__cxx11::string::string(local_7018,local_7038);
                std::__cxx11::string::string((string *)(local_70a0 + 0x40),(string *)&score_22);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_6f60,&local_6f88,(text *)local_7018,
                           (text *)(local_70a0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_70a0);
                std::__cxx11::string::string((string *)(local_70a0 + 0x20),(string *)local_70a0);
                lest::report(poVar1,&local_6f60,(text *)(local_70a0 + 0x20));
                std::__cxx11::string::~string((string *)(local_70a0 + 0x20));
                std::__cxx11::string::~string((string *)local_70a0);
                lest::passing::~passing((passing *)&local_6f60);
                std::__cxx11::string::~string((string *)(local_70a0 + 0x40));
                std::__cxx11::string::~string(local_7018);
                std::__cxx11::string::~string(local_7038);
                std::allocator<char>::~allocator((allocator<char> *)&local_7039);
                lest::location::~location(&local_6f88);
                lest::location::~location(&local_6fb0);
                std::__cxx11::string::~string(local_6fd0);
                std::__cxx11::string::~string(local_6ff0);
                std::allocator<char>::~allocator((allocator<char> *)&local_6ff1);
              }
              lest::result::~result((result *)local_6d30);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xa4;
          lest::ctx::~ctx((ctx *)local_6cc0);
          lest__ctx_section_22._8_4_ =
               lest__ctx_section_22._8_4_ - (uint)(lest__ctx_section_22._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_24,&relop<char,_int,_long>::id1359,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_24);
      if (bVar2) {
        lest__ctx_section_23.once = true;
        lest__ctx_section_23._9_3_ = 0;
        for (lest__ctx_section_23._12_4_ = 0;
            (int)lest__ctx_section_23._12_4_ < (int)lest__ctx_section_23._8_4_;
            lest__ctx_section_23._12_4_ = lest__ctx_section_23._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_71e8,"nullopt    == engaged",(allocator *)&score_23.field_0x27);
          std::__cxx11::string::string(local_71c8,local_71e8);
          lest::ctx::ctx((ctx *)local_71a8,lest_env,(text *)local_71c8);
          std::__cxx11::string::~string(local_71c8);
          std::__cxx11::string::~string(local_71e8);
          std::allocator<char>::~allocator((allocator<char> *)&score_23.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_71a8), bVar2) {
            do {
              local_724a = nonstd::optional_lite::operator!=
                                     ((undefined1 *)((long)&e2.contained + 4));
              local_7248 = (bool *)lest::expression_decomposer::operator<<(&local_7249,&local_724a);
              lest::expression_lhs::operator_cast_to_result
                        (&local_7240,(expression_lhs *)&local_7248);
              lest::result::result((result *)local_7218,&local_7240);
              lest::result::~result(&local_7240);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7218);
              if (bVar2) {
                local_73c9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_7358,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7359);
                std::__cxx11::string::string(local_7338,local_7358);
                lest::location::location(&local_7318,(text *)local_7338,0x54f);
                lest::location::location(&local_72f0,&local_7318);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_73a0,"(nullopt != e1 )",&local_73a1);
                std::__cxx11::string::string(local_7380,local_73a0);
                std::__cxx11::string::string(local_73c8,(string *)&score_23);
                lest::failure::failure
                          (&local_72c8,&local_72f0,(text *)local_7380,(text *)local_73c8);
                lest::failure::failure(pfVar3,&local_72c8);
                local_73c9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_74d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_74d9);
                std::__cxx11::string::string(local_74b8,local_74d8);
                lest::location::location(&local_7498,(text *)local_74b8,0x54f);
                lest::location::location(&local_7470,&local_7498);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7520,"(nullopt != e1 )",&local_7521);
                std::__cxx11::string::string(local_7500,local_7520);
                std::__cxx11::string::string((string *)(local_7588 + 0x40),(string *)&score_23);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7448,&local_7470,(text *)local_7500,
                           (text *)(local_7588 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_7588);
                std::__cxx11::string::string((string *)(local_7588 + 0x20),(string *)local_7588);
                lest::report(poVar1,&local_7448,(text *)(local_7588 + 0x20));
                std::__cxx11::string::~string((string *)(local_7588 + 0x20));
                std::__cxx11::string::~string((string *)local_7588);
                lest::passing::~passing((passing *)&local_7448);
                std::__cxx11::string::~string((string *)(local_7588 + 0x40));
                std::__cxx11::string::~string(local_7500);
                std::__cxx11::string::~string(local_7520);
                std::allocator<char>::~allocator((allocator<char> *)&local_7521);
                lest::location::~location(&local_7470);
                lest::location::~location(&local_7498);
                std::__cxx11::string::~string(local_74b8);
                std::__cxx11::string::~string(local_74d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_74d9);
              }
              lest::result::~result((result *)local_7218);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xab;
          lest::ctx::~ctx((ctx *)local_71a8);
          lest__ctx_section_23._8_4_ =
               lest__ctx_section_23._8_4_ - (uint)(lest__ctx_section_23._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_25,&relop<char,_int,_long>::id1360,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_25);
      if (bVar2) {
        lest__ctx_section_24.once = true;
        lest__ctx_section_24._9_3_ = 0;
        for (lest__ctx_section_24._12_4_ = 0;
            (int)lest__ctx_section_24._12_4_ < (int)lest__ctx_section_24._8_4_;
            lest__ctx_section_24._12_4_ = lest__ctx_section_24._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_76d0,"disengaged == nullopt",(allocator *)&score_24.field_0x27);
          std::__cxx11::string::string(local_76b0,local_76d0);
          lest::ctx::ctx((ctx *)local_7690,lest_env,(text *)local_76b0);
          std::__cxx11::string::~string(local_76b0);
          std::__cxx11::string::~string(local_76d0);
          std::allocator<char>::~allocator((allocator<char> *)&score_24.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_7690), bVar2) {
            do {
              local_7732 = nonstd::optional_lite::operator<(&e1.field_0x2);
              local_7732 = !local_7732;
              local_7730 = (bool *)lest::expression_decomposer::operator<<(&local_7731,&local_7732);
              lest::expression_lhs::operator_cast_to_result
                        (&local_7728,(expression_lhs *)&local_7730);
              lest::result::result((result *)local_7700,&local_7728);
              lest::result::~result(&local_7728);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7700);
              if (bVar2) {
                local_78b1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_7840,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7841);
                std::__cxx11::string::string(local_7820,local_7840);
                lest::location::location(&local_7800,(text *)local_7820,0x550);
                lest::location::location(&local_77d8,&local_7800);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7888,"!(d < nullopt)",&local_7889);
                std::__cxx11::string::string(local_7868,local_7888);
                std::__cxx11::string::string(local_78b0,(string *)&score_24);
                lest::failure::failure
                          (&local_77b0,&local_77d8,(text *)local_7868,(text *)local_78b0);
                lest::failure::failure(pfVar3,&local_77b0);
                local_78b1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_79c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_79c1);
                std::__cxx11::string::string(local_79a0,local_79c0);
                lest::location::location(&local_7980,(text *)local_79a0,0x550);
                lest::location::location(&local_7958,&local_7980);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7a08,"!(d < nullopt)",&local_7a09);
                std::__cxx11::string::string(local_79e8,local_7a08);
                std::__cxx11::string::string((string *)(local_7a70 + 0x40),(string *)&score_24);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7930,&local_7958,(text *)local_79e8,
                           (text *)(local_7a70 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_7a70);
                std::__cxx11::string::string((string *)(local_7a70 + 0x20),(string *)local_7a70);
                lest::report(poVar1,&local_7930,(text *)(local_7a70 + 0x20));
                std::__cxx11::string::~string((string *)(local_7a70 + 0x20));
                std::__cxx11::string::~string((string *)local_7a70);
                lest::passing::~passing((passing *)&local_7930);
                std::__cxx11::string::~string((string *)(local_7a70 + 0x40));
                std::__cxx11::string::~string(local_79e8);
                std::__cxx11::string::~string(local_7a08);
                std::allocator<char>::~allocator((allocator<char> *)&local_7a09);
                lest::location::~location(&local_7958);
                lest::location::~location(&local_7980);
                std::__cxx11::string::~string(local_79a0);
                std::__cxx11::string::~string(local_79c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_79c1);
              }
              lest::result::~result((result *)local_7700);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xb2;
          lest::ctx::~ctx((ctx *)local_7690);
          lest__ctx_section_24._8_4_ =
               lest__ctx_section_24._8_4_ - (uint)(lest__ctx_section_24._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_26,&relop<char,_int,_long>::id1361,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_26);
      if (bVar2) {
        lest__ctx_section_25.once = true;
        lest__ctx_section_25._9_3_ = 0;
        for (lest__ctx_section_25._12_4_ = 0;
            (int)lest__ctx_section_25._12_4_ < (int)lest__ctx_section_25._8_4_;
            lest__ctx_section_25._12_4_ = lest__ctx_section_25._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_7bb8,"nullopt    == disengaged",(allocator *)&score_25.field_0x27);
          std::__cxx11::string::string(local_7b98,local_7bb8);
          lest::ctx::ctx((ctx *)local_7b78,lest_env,(text *)local_7b98);
          std::__cxx11::string::~string(local_7b98);
          std::__cxx11::string::~string(local_7bb8);
          std::allocator<char>::~allocator((allocator<char> *)&score_25.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_7b78), bVar2) {
            do {
              local_7c1a = nonstd::optional_lite::operator<(&e1.field_0x2);
              local_7c1a = !local_7c1a;
              local_7c18 = (bool *)lest::expression_decomposer::operator<<(&local_7c19,&local_7c1a);
              lest::expression_lhs::operator_cast_to_result
                        (&local_7c10,(expression_lhs *)&local_7c18);
              lest::result::result((result *)local_7be8,&local_7c10);
              lest::result::~result(&local_7c10);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_7be8);
              if (bVar2) {
                local_7d99 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_7d28,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7d29);
                std::__cxx11::string::string(local_7d08,local_7d28);
                lest::location::location(&local_7ce8,(text *)local_7d08,0x551);
                lest::location::location(&local_7cc0,&local_7ce8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7d70,"!(nullopt < d )",&local_7d71);
                std::__cxx11::string::string(local_7d50,local_7d70);
                std::__cxx11::string::string(local_7d98,(string *)&score_25);
                lest::failure::failure
                          (&local_7c98,&local_7cc0,(text *)local_7d50,(text *)local_7d98);
                lest::failure::failure(pfVar3,&local_7c98);
                local_7d99 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_7ea8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_7ea9);
                std::__cxx11::string::string(local_7e88,local_7ea8);
                lest::location::location(&local_7e68,(text *)local_7e88,0x551);
                lest::location::location(&local_7e40,&local_7e68);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_7ef0,"!(nullopt < d )",&local_7ef1);
                std::__cxx11::string::string(local_7ed0,local_7ef0);
                std::__cxx11::string::string((string *)(local_7f58 + 0x40),(string *)&score_25);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_7e18,&local_7e40,(text *)local_7ed0,
                           (text *)(local_7f58 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_7f58);
                std::__cxx11::string::string((string *)(local_7f58 + 0x20),(string *)local_7f58);
                lest::report(poVar1,&local_7e18,(text *)(local_7f58 + 0x20));
                std::__cxx11::string::~string((string *)(local_7f58 + 0x20));
                std::__cxx11::string::~string((string *)local_7f58);
                lest::passing::~passing((passing *)&local_7e18);
                std::__cxx11::string::~string((string *)(local_7f58 + 0x40));
                std::__cxx11::string::~string(local_7ed0);
                std::__cxx11::string::~string(local_7ef0);
                std::allocator<char>::~allocator((allocator<char> *)&local_7ef1);
                lest::location::~location(&local_7e40);
                lest::location::~location(&local_7e68);
                std::__cxx11::string::~string(local_7e88);
                std::__cxx11::string::~string(local_7ea8);
                std::allocator<char>::~allocator((allocator<char> *)&local_7ea9);
              }
              lest::result::~result((result *)local_7be8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xb9;
          lest::ctx::~ctx((ctx *)local_7b78);
          lest__ctx_section_25._8_4_ =
               lest__ctx_section_25._8_4_ - (uint)(lest__ctx_section_25._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_27,&relop<char,_int,_long>::id1362,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_27);
      if (bVar2) {
        lest__ctx_section_26.once = true;
        lest__ctx_section_26._9_3_ = 0;
        for (lest__ctx_section_26._12_4_ = 0;
            (int)lest__ctx_section_26._12_4_ < (int)lest__ctx_section_26._8_4_;
            lest__ctx_section_26._12_4_ = lest__ctx_section_26._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_80a0,"disengaged == nullopt",(allocator *)&score_26.field_0x27);
          std::__cxx11::string::string(local_8080,local_80a0);
          lest::ctx::ctx((ctx *)local_8060,lest_env,(text *)local_8080);
          std::__cxx11::string::~string(local_8080);
          std::__cxx11::string::~string(local_80a0);
          std::allocator<char>::~allocator((allocator<char> *)&score_26.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_8060), bVar2) {
            do {
              local_8102 = nonstd::optional_lite::operator<=(&e1.field_0x2);
              local_8100 = (bool *)lest::expression_decomposer::operator<<(&local_8101,&local_8102);
              lest::expression_lhs::operator_cast_to_result
                        (&local_80f8,(expression_lhs *)&local_8100);
              lest::result::result((result *)local_80d0,&local_80f8);
              lest::result::~result(&local_80f8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_80d0);
              if (bVar2) {
                local_8281 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8210,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_8211);
                std::__cxx11::string::string(local_81f0,local_8210);
                lest::location::location(&local_81d0,(text *)local_81f0,0x552);
                lest::location::location(&local_81a8,&local_81d0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_8258,"(d <= nullopt)",&local_8259);
                std::__cxx11::string::string(local_8238,local_8258);
                std::__cxx11::string::string(local_8280,(string *)&score_26);
                lest::failure::failure
                          (&local_8180,&local_81a8,(text *)local_8238,(text *)local_8280);
                lest::failure::failure(pfVar3,&local_8180);
                local_8281 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8390,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_8391);
                std::__cxx11::string::string(local_8370,local_8390);
                lest::location::location(&local_8350,(text *)local_8370,0x552);
                lest::location::location(&local_8328,&local_8350);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_83d8,"(d <= nullopt)",&local_83d9);
                std::__cxx11::string::string(local_83b8,local_83d8);
                std::__cxx11::string::string((string *)(local_8440 + 0x40),(string *)&score_26);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_8300,&local_8328,(text *)local_83b8,
                           (text *)(local_8440 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_8440);
                std::__cxx11::string::string((string *)(local_8440 + 0x20),(string *)local_8440);
                lest::report(poVar1,&local_8300,(text *)(local_8440 + 0x20));
                std::__cxx11::string::~string((string *)(local_8440 + 0x20));
                std::__cxx11::string::~string((string *)local_8440);
                lest::passing::~passing((passing *)&local_8300);
                std::__cxx11::string::~string((string *)(local_8440 + 0x40));
                std::__cxx11::string::~string(local_83b8);
                std::__cxx11::string::~string(local_83d8);
                std::allocator<char>::~allocator((allocator<char> *)&local_83d9);
                lest::location::~location(&local_8328);
                lest::location::~location(&local_8350);
                std::__cxx11::string::~string(local_8370);
                std::__cxx11::string::~string(local_8390);
                std::allocator<char>::~allocator((allocator<char> *)&local_8391);
              }
              lest::result::~result((result *)local_80d0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xc0;
          lest::ctx::~ctx((ctx *)local_8060);
          lest__ctx_section_26._8_4_ =
               lest__ctx_section_26._8_4_ - (uint)(lest__ctx_section_26._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_28,&relop<char,_int,_long>::id1363,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_28);
      if (bVar2) {
        lest__ctx_section_27.once = true;
        lest__ctx_section_27._9_3_ = 0;
        for (lest__ctx_section_27._12_4_ = 0;
            (int)lest__ctx_section_27._12_4_ < (int)lest__ctx_section_27._8_4_;
            lest__ctx_section_27._12_4_ = lest__ctx_section_27._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_8588,"nullopt    == disengaged",(allocator *)&score_27.field_0x27);
          std::__cxx11::string::string(local_8568,local_8588);
          lest::ctx::ctx((ctx *)local_8548,lest_env,(text *)local_8568);
          std::__cxx11::string::~string(local_8568);
          std::__cxx11::string::~string(local_8588);
          std::allocator<char>::~allocator((allocator<char> *)&score_27.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_8548), bVar2) {
            do {
              local_85ea = nonstd::optional_lite::operator<=(&e1.field_0x2);
              local_85e8 = (bool *)lest::expression_decomposer::operator<<(&local_85e9,&local_85ea);
              lest::expression_lhs::operator_cast_to_result
                        (&local_85e0,(expression_lhs *)&local_85e8);
              lest::result::result((result *)local_85b8,&local_85e0);
              lest::result::~result(&local_85e0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_85b8);
              if (bVar2) {
                local_8769 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_86f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_86f9);
                std::__cxx11::string::string(local_86d8,local_86f8);
                lest::location::location(&local_86b8,(text *)local_86d8,0x553);
                lest::location::location(&local_8690,&local_86b8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_8740,"(nullopt <= d )",&local_8741);
                std::__cxx11::string::string(local_8720,local_8740);
                std::__cxx11::string::string(local_8768,(string *)&score_27);
                lest::failure::failure
                          (&local_8668,&local_8690,(text *)local_8720,(text *)local_8768);
                lest::failure::failure(pfVar3,&local_8668);
                local_8769 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8878,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_8879);
                std::__cxx11::string::string(local_8858,local_8878);
                lest::location::location(&local_8838,(text *)local_8858,0x553);
                lest::location::location(&local_8810,&local_8838);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_88c0,"(nullopt <= d )",&local_88c1);
                std::__cxx11::string::string(local_88a0,local_88c0);
                std::__cxx11::string::string((string *)(local_8928 + 0x40),(string *)&score_27);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_87e8,&local_8810,(text *)local_88a0,
                           (text *)(local_8928 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_8928);
                std::__cxx11::string::string((string *)(local_8928 + 0x20),(string *)local_8928);
                lest::report(poVar1,&local_87e8,(text *)(local_8928 + 0x20));
                std::__cxx11::string::~string((string *)(local_8928 + 0x20));
                std::__cxx11::string::~string((string *)local_8928);
                lest::passing::~passing((passing *)&local_87e8);
                std::__cxx11::string::~string((string *)(local_8928 + 0x40));
                std::__cxx11::string::~string(local_88a0);
                std::__cxx11::string::~string(local_88c0);
                std::allocator<char>::~allocator((allocator<char> *)&local_88c1);
                lest::location::~location(&local_8810);
                lest::location::~location(&local_8838);
                std::__cxx11::string::~string(local_8858);
                std::__cxx11::string::~string(local_8878);
                std::allocator<char>::~allocator((allocator<char> *)&local_8879);
              }
              lest::result::~result((result *)local_85b8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xc7;
          lest::ctx::~ctx((ctx *)local_8548);
          lest__ctx_section_27._8_4_ =
               lest__ctx_section_27._8_4_ - (uint)(lest__ctx_section_27._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_29,&relop<char,_int,_long>::id1364,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_29);
      if (bVar2) {
        lest__ctx_section_28.once = true;
        lest__ctx_section_28._9_3_ = 0;
        for (lest__ctx_section_28._12_4_ = 0;
            (int)lest__ctx_section_28._12_4_ < (int)lest__ctx_section_28._8_4_;
            lest__ctx_section_28._12_4_ = lest__ctx_section_28._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_8a70,"disengaged == nullopt",(allocator *)&score_28.field_0x27);
          std::__cxx11::string::string(local_8a50,local_8a70);
          lest::ctx::ctx((ctx *)local_8a30,lest_env,(text *)local_8a50);
          std::__cxx11::string::~string(local_8a50);
          std::__cxx11::string::~string(local_8a70);
          std::allocator<char>::~allocator((allocator<char> *)&score_28.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_8a30), bVar2) {
            do {
              local_8ad2 = nonstd::optional_lite::operator>(&e1.field_0x2);
              local_8ad2 = !local_8ad2;
              local_8ad0 = (bool *)lest::expression_decomposer::operator<<(&local_8ad1,&local_8ad2);
              lest::expression_lhs::operator_cast_to_result
                        (&local_8ac8,(expression_lhs *)&local_8ad0);
              lest::result::result((result *)local_8aa0,&local_8ac8);
              lest::result::~result(&local_8ac8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_8aa0);
              if (bVar2) {
                local_8c51 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8be0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_8be1);
                std::__cxx11::string::string(local_8bc0,local_8be0);
                lest::location::location(&local_8ba0,(text *)local_8bc0,0x554);
                lest::location::location(&local_8b78,&local_8ba0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_8c28,"!(d > nullopt)",&local_8c29);
                std::__cxx11::string::string(local_8c08,local_8c28);
                std::__cxx11::string::string(local_8c50,(string *)&score_28);
                lest::failure::failure
                          (&local_8b50,&local_8b78,(text *)local_8c08,(text *)local_8c50);
                lest::failure::failure(pfVar3,&local_8b50);
                local_8c51 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_8d60,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_8d61);
                std::__cxx11::string::string(local_8d40,local_8d60);
                lest::location::location(&local_8d20,(text *)local_8d40,0x554);
                lest::location::location(&local_8cf8,&local_8d20);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_8da8,"!(d > nullopt)",&local_8da9);
                std::__cxx11::string::string(local_8d88,local_8da8);
                std::__cxx11::string::string((string *)(local_8e10 + 0x40),(string *)&score_28);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_8cd0,&local_8cf8,(text *)local_8d88,
                           (text *)(local_8e10 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_8e10);
                std::__cxx11::string::string((string *)(local_8e10 + 0x20),(string *)local_8e10);
                lest::report(poVar1,&local_8cd0,(text *)(local_8e10 + 0x20));
                std::__cxx11::string::~string((string *)(local_8e10 + 0x20));
                std::__cxx11::string::~string((string *)local_8e10);
                lest::passing::~passing((passing *)&local_8cd0);
                std::__cxx11::string::~string((string *)(local_8e10 + 0x40));
                std::__cxx11::string::~string(local_8d88);
                std::__cxx11::string::~string(local_8da8);
                std::allocator<char>::~allocator((allocator<char> *)&local_8da9);
                lest::location::~location(&local_8cf8);
                lest::location::~location(&local_8d20);
                std::__cxx11::string::~string(local_8d40);
                std::__cxx11::string::~string(local_8d60);
                std::allocator<char>::~allocator((allocator<char> *)&local_8d61);
              }
              lest::result::~result((result *)local_8aa0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xce;
          lest::ctx::~ctx((ctx *)local_8a30);
          lest__ctx_section_28._8_4_ =
               lest__ctx_section_28._8_4_ - (uint)(lest__ctx_section_28._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_30,&relop<char,_int,_long>::id1365,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_30);
      if (bVar2) {
        lest__ctx_section_29.once = true;
        lest__ctx_section_29._9_3_ = 0;
        for (lest__ctx_section_29._12_4_ = 0;
            (int)lest__ctx_section_29._12_4_ < (int)lest__ctx_section_29._8_4_;
            lest__ctx_section_29._12_4_ = lest__ctx_section_29._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_8f58,"nullopt    == disengaged",(allocator *)&score_29.field_0x27);
          std::__cxx11::string::string(local_8f38,local_8f58);
          lest::ctx::ctx((ctx *)local_8f18,lest_env,(text *)local_8f38);
          std::__cxx11::string::~string(local_8f38);
          std::__cxx11::string::~string(local_8f58);
          std::allocator<char>::~allocator((allocator<char> *)&score_29.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_8f18), bVar2) {
            do {
              local_8fba = nonstd::optional_lite::operator>(&e1.field_0x2);
              local_8fba = !local_8fba;
              local_8fb8 = (bool *)lest::expression_decomposer::operator<<(&local_8fb9,&local_8fba);
              lest::expression_lhs::operator_cast_to_result
                        (&local_8fb0,(expression_lhs *)&local_8fb8);
              lest::result::result((result *)local_8f88,&local_8fb0);
              lest::result::~result(&local_8fb0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_8f88);
              if (bVar2) {
                local_9139 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_90c8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_90c9);
                std::__cxx11::string::string(local_90a8,local_90c8);
                lest::location::location(&local_9088,(text *)local_90a8,0x555);
                lest::location::location(&local_9060,&local_9088);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9110,"!(nullopt > d )",&local_9111);
                std::__cxx11::string::string(local_90f0,local_9110);
                std::__cxx11::string::string(local_9138,(string *)&score_29);
                lest::failure::failure
                          (&local_9038,&local_9060,(text *)local_90f0,(text *)local_9138);
                lest::failure::failure(pfVar3,&local_9038);
                local_9139 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_9248,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_9249);
                std::__cxx11::string::string(local_9228,local_9248);
                lest::location::location(&local_9208,(text *)local_9228,0x555);
                lest::location::location(&local_91e0,&local_9208);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9290,"!(nullopt > d )",&local_9291);
                std::__cxx11::string::string(local_9270,local_9290);
                std::__cxx11::string::string((string *)(local_92f8 + 0x40),(string *)&score_29);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_91b8,&local_91e0,(text *)local_9270,
                           (text *)(local_92f8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_92f8);
                std::__cxx11::string::string((string *)(local_92f8 + 0x20),(string *)local_92f8);
                lest::report(poVar1,&local_91b8,(text *)(local_92f8 + 0x20));
                std::__cxx11::string::~string((string *)(local_92f8 + 0x20));
                std::__cxx11::string::~string((string *)local_92f8);
                lest::passing::~passing((passing *)&local_91b8);
                std::__cxx11::string::~string((string *)(local_92f8 + 0x40));
                std::__cxx11::string::~string(local_9270);
                std::__cxx11::string::~string(local_9290);
                std::allocator<char>::~allocator((allocator<char> *)&local_9291);
                lest::location::~location(&local_91e0);
                lest::location::~location(&local_9208);
                std::__cxx11::string::~string(local_9228);
                std::__cxx11::string::~string(local_9248);
                std::allocator<char>::~allocator((allocator<char> *)&local_9249);
              }
              lest::result::~result((result *)local_8f88);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xd5;
          lest::ctx::~ctx((ctx *)local_8f18);
          lest__ctx_section_29._8_4_ =
               lest__ctx_section_29._8_4_ - (uint)(lest__ctx_section_29._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_31,&relop<char,_int,_long>::id1366,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_31);
      if (bVar2) {
        lest__ctx_section_30.once = true;
        lest__ctx_section_30._9_3_ = 0;
        for (lest__ctx_section_30._12_4_ = 0;
            (int)lest__ctx_section_30._12_4_ < (int)lest__ctx_section_30._8_4_;
            lest__ctx_section_30._12_4_ = lest__ctx_section_30._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_9440,"disengaged == nullopt",(allocator *)&score_30.field_0x27);
          std::__cxx11::string::string(local_9420,local_9440);
          lest::ctx::ctx((ctx *)local_9400,lest_env,(text *)local_9420);
          std::__cxx11::string::~string(local_9420);
          std::__cxx11::string::~string(local_9440);
          std::allocator<char>::~allocator((allocator<char> *)&score_30.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_9400), bVar2) {
            do {
              local_94a2 = nonstd::optional_lite::operator>=(&e1.field_0x2);
              local_94a0 = (bool *)lest::expression_decomposer::operator<<(&local_94a1,&local_94a2);
              lest::expression_lhs::operator_cast_to_result
                        (&local_9498,(expression_lhs *)&local_94a0);
              lest::result::result((result *)local_9470,&local_9498);
              lest::result::~result(&local_9498);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_9470);
              if (bVar2) {
                local_9621 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_95b0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_95b1);
                std::__cxx11::string::string(local_9590,local_95b0);
                lest::location::location(&local_9570,(text *)local_9590,0x556);
                lest::location::location(&local_9548,&local_9570);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_95f8,"(d >= nullopt)",&local_95f9);
                std::__cxx11::string::string(local_95d8,local_95f8);
                std::__cxx11::string::string(local_9620,(string *)&score_30);
                lest::failure::failure
                          (&local_9520,&local_9548,(text *)local_95d8,(text *)local_9620);
                lest::failure::failure(pfVar3,&local_9520);
                local_9621 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_9730,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_9731);
                std::__cxx11::string::string(local_9710,local_9730);
                lest::location::location(&local_96f0,(text *)local_9710,0x556);
                lest::location::location(&local_96c8,&local_96f0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9778,"(d >= nullopt)",&local_9779);
                std::__cxx11::string::string(local_9758,local_9778);
                std::__cxx11::string::string((string *)(local_97e0 + 0x40),(string *)&score_30);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_96a0,&local_96c8,(text *)local_9758,
                           (text *)(local_97e0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_97e0);
                std::__cxx11::string::string((string *)(local_97e0 + 0x20),(string *)local_97e0);
                lest::report(poVar1,&local_96a0,(text *)(local_97e0 + 0x20));
                std::__cxx11::string::~string((string *)(local_97e0 + 0x20));
                std::__cxx11::string::~string((string *)local_97e0);
                lest::passing::~passing((passing *)&local_96a0);
                std::__cxx11::string::~string((string *)(local_97e0 + 0x40));
                std::__cxx11::string::~string(local_9758);
                std::__cxx11::string::~string(local_9778);
                std::allocator<char>::~allocator((allocator<char> *)&local_9779);
                lest::location::~location(&local_96c8);
                lest::location::~location(&local_96f0);
                std::__cxx11::string::~string(local_9710);
                std::__cxx11::string::~string(local_9730);
                std::allocator<char>::~allocator((allocator<char> *)&local_9731);
              }
              lest::result::~result((result *)local_9470);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xdc;
          lest::ctx::~ctx((ctx *)local_9400);
          lest__ctx_section_30._8_4_ =
               lest__ctx_section_30._8_4_ - (uint)(lest__ctx_section_30._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_32,&relop<char,_int,_long>::id1367,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_32);
      if (bVar2) {
        lest__ctx_section_31.once = true;
        lest__ctx_section_31._9_3_ = 0;
        for (lest__ctx_section_31._12_4_ = 0;
            (int)lest__ctx_section_31._12_4_ < (int)lest__ctx_section_31._8_4_;
            lest__ctx_section_31._12_4_ = lest__ctx_section_31._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_9928,"nullopt    == disengaged",(allocator *)&score_31.field_0x27);
          std::__cxx11::string::string(local_9908,local_9928);
          lest::ctx::ctx((ctx *)local_98e8,lest_env,(text *)local_9908);
          std::__cxx11::string::~string(local_9908);
          std::__cxx11::string::~string(local_9928);
          std::allocator<char>::~allocator((allocator<char> *)&score_31.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_98e8), bVar2) {
            do {
              local_998a = nonstd::optional_lite::operator>=(&e1.field_0x2);
              local_9988 = (bool *)lest::expression_decomposer::operator<<(&local_9989,&local_998a);
              lest::expression_lhs::operator_cast_to_result
                        (&local_9980,(expression_lhs *)&local_9988);
              lest::result::result((result *)local_9958,&local_9980);
              lest::result::~result(&local_9980);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_9958);
              if (bVar2) {
                local_9b09 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_9a98,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_9a99);
                std::__cxx11::string::string(local_9a78,local_9a98);
                lest::location::location(&local_9a58,(text *)local_9a78,0x557);
                lest::location::location(&local_9a30,&local_9a58);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9ae0,"(nullopt >= d )",&local_9ae1);
                std::__cxx11::string::string(local_9ac0,local_9ae0);
                std::__cxx11::string::string(local_9b08,(string *)&score_31);
                lest::failure::failure
                          (&local_9a08,&local_9a30,(text *)local_9ac0,(text *)local_9b08);
                lest::failure::failure(pfVar3,&local_9a08);
                local_9b09 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_9c18,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_9c19);
                std::__cxx11::string::string(local_9bf8,local_9c18);
                lest::location::location(&local_9bd8,(text *)local_9bf8,0x557);
                lest::location::location(&local_9bb0,&local_9bd8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9c60,"(nullopt >= d )",&local_9c61);
                std::__cxx11::string::string(local_9c40,local_9c60);
                std::__cxx11::string::string((string *)(local_9cc8 + 0x40),(string *)&score_31);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_9b88,&local_9bb0,(text *)local_9c40,
                           (text *)(local_9cc8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_9cc8);
                std::__cxx11::string::string((string *)(local_9cc8 + 0x20),(string *)local_9cc8);
                lest::report(poVar1,&local_9b88,(text *)(local_9cc8 + 0x20));
                std::__cxx11::string::~string((string *)(local_9cc8 + 0x20));
                std::__cxx11::string::~string((string *)local_9cc8);
                lest::passing::~passing((passing *)&local_9b88);
                std::__cxx11::string::~string((string *)(local_9cc8 + 0x40));
                std::__cxx11::string::~string(local_9c40);
                std::__cxx11::string::~string(local_9c60);
                std::allocator<char>::~allocator((allocator<char> *)&local_9c61);
                lest::location::~location(&local_9bb0);
                lest::location::~location(&local_9bd8);
                std::__cxx11::string::~string(local_9bf8);
                std::__cxx11::string::~string(local_9c18);
                std::allocator<char>::~allocator((allocator<char> *)&local_9c19);
              }
              lest::result::~result((result *)local_9958);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xe3;
          lest::ctx::~ctx((ctx *)local_98e8);
          lest__ctx_section_31._8_4_ =
               lest__ctx_section_31._8_4_ - (uint)(lest__ctx_section_31._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_33,&relop<char,_int,_long>::id1369,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_33);
      if (bVar2) {
        lest__ctx_section_32.once = true;
        lest__ctx_section_32._9_3_ = 0;
        for (lest__ctx_section_32._12_4_ = 0;
            (int)lest__ctx_section_32._12_4_ < (int)lest__ctx_section_32._8_4_;
            lest__ctx_section_32._12_4_ = lest__ctx_section_32._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_9e10,"engaged    == value",(allocator *)&score_32.field_0x27);
          std::__cxx11::string::string(local_9df0,local_9e10);
          lest::ctx::ctx((ctx *)local_9dd0,lest_env,(text *)local_9df0);
          std::__cxx11::string::~string(local_9df0);
          std::__cxx11::string::~string(local_9e10);
          std::allocator<char>::~allocator((allocator<char> *)&score_32.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_9dd0), bVar2) {
            do {
              local_9e70 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_9e71,(optional<int> *)((long)&e2.contained + 4));
              local_9e78 = 6;
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator==
                        (&local_9e68,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_9e70,
                         &local_9e78);
              lest::result::result((result *)local_9e40,&local_9e68);
              lest::result::~result(&local_9e68);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_9e40);
              if (bVar2) {
                local_9ff1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_9f80,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_9f81);
                std::__cxx11::string::string(local_9f60,local_9f80);
                lest::location::location(&local_9f40,(text *)local_9f60,0x559);
                lest::location::location(&local_9f18,&local_9f40);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_9fc8,"e1 == 6",&local_9fc9);
                std::__cxx11::string::string(local_9fa8,local_9fc8);
                std::__cxx11::string::string(local_9ff0,(string *)&score_32);
                lest::failure::failure
                          (&local_9ef0,&local_9f18,(text *)local_9fa8,(text *)local_9ff0);
                lest::failure::failure(pfVar3,&local_9ef0);
                local_9ff1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a100,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_a101);
                std::__cxx11::string::string(local_a0e0,local_a100);
                lest::location::location(&local_a0c0,(text *)local_a0e0,0x559);
                lest::location::location(&local_a098,&local_a0c0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a148,"e1 == 6",&local_a149);
                std::__cxx11::string::string(local_a128,local_a148);
                std::__cxx11::string::string((string *)(local_a1b0 + 0x40),(string *)&score_32);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_a070,&local_a098,(text *)local_a128,
                           (text *)(local_a1b0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_a1b0);
                std::__cxx11::string::string((string *)(local_a1b0 + 0x20),(string *)local_a1b0);
                lest::report(poVar1,&local_a070,(text *)(local_a1b0 + 0x20));
                std::__cxx11::string::~string((string *)(local_a1b0 + 0x20));
                std::__cxx11::string::~string((string *)local_a1b0);
                lest::passing::~passing((passing *)&local_a070);
                std::__cxx11::string::~string((string *)(local_a1b0 + 0x40));
                std::__cxx11::string::~string(local_a128);
                std::__cxx11::string::~string(local_a148);
                std::allocator<char>::~allocator((allocator<char> *)&local_a149);
                lest::location::~location(&local_a098);
                lest::location::~location(&local_a0c0);
                std::__cxx11::string::~string(local_a0e0);
                std::__cxx11::string::~string(local_a100);
                std::allocator<char>::~allocator((allocator<char> *)&local_a101);
              }
              lest::result::~result((result *)local_9e40);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xea;
          lest::ctx::~ctx((ctx *)local_9dd0);
          lest__ctx_section_32._8_4_ =
               lest__ctx_section_32._8_4_ - (uint)(lest__ctx_section_32._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_34,&relop<char,_int,_long>::id1370,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_34);
      if (bVar2) {
        lest__ctx_section_33.once = true;
        lest__ctx_section_33._9_3_ = 0;
        for (lest__ctx_section_33._12_4_ = 0;
            (int)lest__ctx_section_33._12_4_ < (int)lest__ctx_section_33._8_4_;
            lest__ctx_section_33._12_4_ = lest__ctx_section_33._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a2f8,"value     == engaged",(allocator *)&score_33.field_0x27);
          std::__cxx11::string::string(local_a2d8,local_a2f8);
          lest::ctx::ctx((ctx *)local_a2b8,lest_env,(text *)local_a2d8);
          std::__cxx11::string::~string(local_a2d8);
          std::__cxx11::string::~string(local_a2f8);
          std::allocator<char>::~allocator((allocator<char> *)&score_33.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_a2b8), bVar2) {
            do {
              local_a360 = 6;
              local_a358 = (int *)lest::expression_decomposer::operator<<(&local_a359,&local_a360);
              lest::expression_lhs<int_const&>::operator==
                        (&local_a350,(expression_lhs<int_const&> *)&local_a358,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_a328,&local_a350);
              lest::result::~result(&local_a350);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_a328);
              if (bVar2) {
                local_a4d9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a468,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_a469);
                std::__cxx11::string::string(local_a448,local_a468);
                lest::location::location(&local_a428,(text *)local_a448,0x55a);
                lest::location::location(&local_a400,&local_a428);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a4b0,"6 == e1",&local_a4b1);
                std::__cxx11::string::string(local_a490,local_a4b0);
                std::__cxx11::string::string(local_a4d8,(string *)&score_33);
                lest::failure::failure
                          (&local_a3d8,&local_a400,(text *)local_a490,(text *)local_a4d8);
                lest::failure::failure(pfVar3,&local_a3d8);
                local_a4d9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a5e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_a5e9);
                std::__cxx11::string::string(local_a5c8,local_a5e8);
                lest::location::location(&local_a5a8,(text *)local_a5c8,0x55a);
                lest::location::location(&local_a580,&local_a5a8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a630,"6 == e1",&local_a631);
                std::__cxx11::string::string(local_a610,local_a630);
                std::__cxx11::string::string((string *)(local_a698 + 0x40),(string *)&score_33);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_a558,&local_a580,(text *)local_a610,
                           (text *)(local_a698 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_a698);
                std::__cxx11::string::string((string *)(local_a698 + 0x20),(string *)local_a698);
                lest::report(poVar1,&local_a558,(text *)(local_a698 + 0x20));
                std::__cxx11::string::~string((string *)(local_a698 + 0x20));
                std::__cxx11::string::~string((string *)local_a698);
                lest::passing::~passing((passing *)&local_a558);
                std::__cxx11::string::~string((string *)(local_a698 + 0x40));
                std::__cxx11::string::~string(local_a610);
                std::__cxx11::string::~string(local_a630);
                std::allocator<char>::~allocator((allocator<char> *)&local_a631);
                lest::location::~location(&local_a580);
                lest::location::~location(&local_a5a8);
                std::__cxx11::string::~string(local_a5c8);
                std::__cxx11::string::~string(local_a5e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_a5e9);
              }
              lest::result::~result((result *)local_a328);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xf1;
          lest::ctx::~ctx((ctx *)local_a2b8);
          lest__ctx_section_33._8_4_ =
               lest__ctx_section_33._8_4_ - (uint)(lest__ctx_section_33._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_35,&relop<char,_int,_long>::id1371,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_35);
      if (bVar2) {
        lest__ctx_section_34.once = true;
        lest__ctx_section_34._9_3_ = 0;
        for (lest__ctx_section_34._12_4_ = 0;
            (int)lest__ctx_section_34._12_4_ < (int)lest__ctx_section_34._8_4_;
            lest__ctx_section_34._12_4_ = lest__ctx_section_34._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_a7e0,"engaged   != value",(allocator *)&score_34.field_0x27);
          std::__cxx11::string::string(local_a7c0,local_a7e0);
          lest::ctx::ctx((ctx *)local_a7a0,lest_env,(text *)local_a7c0);
          std::__cxx11::string::~string(local_a7c0);
          std::__cxx11::string::~string(local_a7e0);
          std::allocator<char>::~allocator((allocator<char> *)&score_34.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_a7a0), bVar2) {
            do {
              local_a840 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_a841,(optional<int> *)((long)&e2.contained + 4));
              local_a848 = 7;
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator!=
                        (&local_a838,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_a840,
                         &local_a848);
              lest::result::result((result *)local_a810,&local_a838);
              lest::result::~result(&local_a838);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_a810);
              if (bVar2) {
                local_a9c1 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_a950,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_a951);
                std::__cxx11::string::string(local_a930,local_a950);
                lest::location::location(&local_a910,(text *)local_a930,0x55b);
                lest::location::location(&local_a8e8,&local_a910);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_a998,"e1 != 7",&local_a999);
                std::__cxx11::string::string(local_a978,local_a998);
                std::__cxx11::string::string(local_a9c0,(string *)&score_34);
                lest::failure::failure
                          (&local_a8c0,&local_a8e8,(text *)local_a978,(text *)local_a9c0);
                lest::failure::failure(pfVar3,&local_a8c0);
                local_a9c1 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_aad0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_aad1);
                std::__cxx11::string::string(local_aab0,local_aad0);
                lest::location::location(&local_aa90,(text *)local_aab0,0x55b);
                lest::location::location(&local_aa68,&local_aa90);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_ab18,"e1 != 7",&local_ab19);
                std::__cxx11::string::string(local_aaf8,local_ab18);
                std::__cxx11::string::string((string *)(local_ab80 + 0x40),(string *)&score_34);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_aa40,&local_aa68,(text *)local_aaf8,
                           (text *)(local_ab80 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_ab80);
                std::__cxx11::string::string((string *)(local_ab80 + 0x20),(string *)local_ab80);
                lest::report(poVar1,&local_aa40,(text *)(local_ab80 + 0x20));
                std::__cxx11::string::~string((string *)(local_ab80 + 0x20));
                std::__cxx11::string::~string((string *)local_ab80);
                lest::passing::~passing((passing *)&local_aa40);
                std::__cxx11::string::~string((string *)(local_ab80 + 0x40));
                std::__cxx11::string::~string(local_aaf8);
                std::__cxx11::string::~string(local_ab18);
                std::allocator<char>::~allocator((allocator<char> *)&local_ab19);
                lest::location::~location(&local_aa68);
                lest::location::~location(&local_aa90);
                std::__cxx11::string::~string(local_aab0);
                std::__cxx11::string::~string(local_aad0);
                std::allocator<char>::~allocator((allocator<char> *)&local_aad1);
              }
              lest::result::~result((result *)local_a810);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xf8;
          lest::ctx::~ctx((ctx *)local_a7a0);
          lest__ctx_section_34._8_4_ =
               lest__ctx_section_34._8_4_ - (uint)(lest__ctx_section_34._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_36,&relop<char,_int,_long>::id1372,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_36);
      if (bVar2) {
        lest__ctx_section_35.once = true;
        lest__ctx_section_35._9_3_ = 0;
        for (lest__ctx_section_35._12_4_ = 0;
            (int)lest__ctx_section_35._12_4_ < (int)lest__ctx_section_35._8_4_;
            lest__ctx_section_35._12_4_ = lest__ctx_section_35._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_acc8,"value     != engaged",(allocator *)&score_35.field_0x27);
          std::__cxx11::string::string(local_aca8,local_acc8);
          lest::ctx::ctx((ctx *)local_ac88,lest_env,(text *)local_aca8);
          std::__cxx11::string::~string(local_aca8);
          std::__cxx11::string::~string(local_acc8);
          std::allocator<char>::~allocator((allocator<char> *)&score_35.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_ac88), bVar2) {
            do {
              local_ad30 = 6;
              local_ad28 = (int *)lest::expression_decomposer::operator<<(&local_ad29,&local_ad30);
              lest::expression_lhs<int_const&>::operator!=
                        (&local_ad20,(expression_lhs<int_const&> *)&local_ad28,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_acf8,&local_ad20);
              lest::result::~result(&local_ad20);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_acf8);
              if (bVar2) {
                local_aea9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_ae38,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_ae39);
                std::__cxx11::string::string(local_ae18,local_ae38);
                lest::location::location(&local_adf8,(text *)local_ae18,0x55c);
                lest::location::location(&local_add0,&local_adf8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_ae80,"6 != e2",&local_ae81);
                std::__cxx11::string::string(local_ae60,local_ae80);
                std::__cxx11::string::string(local_aea8,(string *)&score_35);
                lest::failure::failure
                          (&local_ada8,&local_add0,(text *)local_ae60,(text *)local_aea8);
                lest::failure::failure(pfVar3,&local_ada8);
                local_aea9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_afb8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_afb9);
                std::__cxx11::string::string(local_af98,local_afb8);
                lest::location::location(&local_af78,(text *)local_af98,0x55c);
                lest::location::location(&local_af50,&local_af78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_b000,"6 != e2",&local_b001);
                std::__cxx11::string::string(local_afe0,local_b000);
                std::__cxx11::string::string((string *)(local_b068 + 0x40),(string *)&score_35);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_af28,&local_af50,(text *)local_afe0,
                           (text *)(local_b068 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_b068);
                std::__cxx11::string::string((string *)(local_b068 + 0x20),(string *)local_b068);
                lest::report(poVar1,&local_af28,(text *)(local_b068 + 0x20));
                std::__cxx11::string::~string((string *)(local_b068 + 0x20));
                std::__cxx11::string::~string((string *)local_b068);
                lest::passing::~passing((passing *)&local_af28);
                std::__cxx11::string::~string((string *)(local_b068 + 0x40));
                std::__cxx11::string::~string(local_afe0);
                std::__cxx11::string::~string(local_b000);
                std::allocator<char>::~allocator((allocator<char> *)&local_b001);
                lest::location::~location(&local_af50);
                lest::location::~location(&local_af78);
                std::__cxx11::string::~string(local_af98);
                std::__cxx11::string::~string(local_afb8);
                std::allocator<char>::~allocator((allocator<char> *)&local_afb9);
              }
              lest::result::~result((result *)local_acf8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0xff;
          lest::ctx::~ctx((ctx *)local_ac88);
          lest__ctx_section_35._8_4_ =
               lest__ctx_section_35._8_4_ - (uint)(lest__ctx_section_35._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_37,&relop<char,_int,_long>::id1373,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_37);
      if (bVar2) {
        lest__ctx_section_36.once = true;
        lest__ctx_section_36._9_3_ = 0;
        for (lest__ctx_section_36._12_4_ = 0;
            (int)lest__ctx_section_36._12_4_ < (int)lest__ctx_section_36._8_4_;
            lest__ctx_section_36._12_4_ = lest__ctx_section_36._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_b1b0,"engaged   <  value",(allocator *)&score_36.field_0x27);
          std::__cxx11::string::string(local_b190,local_b1b0);
          lest::ctx::ctx((ctx *)local_b170,lest_env,(text *)local_b190);
          std::__cxx11::string::~string(local_b190);
          std::__cxx11::string::~string(local_b1b0);
          std::allocator<char>::~allocator((allocator<char> *)&score_36.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_b170), bVar2) {
            do {
              local_b210 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_b211,(optional<int> *)((long)&e2.contained + 4));
              local_b218 = 7;
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<
                        (&local_b208,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_b210,
                         &local_b218);
              lest::result::result((result *)local_b1e0,&local_b208);
              lest::result::~result(&local_b208);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_b1e0);
              if (bVar2) {
                local_b391 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_b320,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_b321);
                std::__cxx11::string::string(local_b300,local_b320);
                lest::location::location(&local_b2e0,(text *)local_b300,0x55d);
                lest::location::location(&local_b2b8,&local_b2e0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_b368,"e1 < 7",&local_b369);
                std::__cxx11::string::string(local_b348,local_b368);
                std::__cxx11::string::string(local_b390,(string *)&score_36);
                lest::failure::failure
                          (&local_b290,&local_b2b8,(text *)local_b348,(text *)local_b390);
                lest::failure::failure(pfVar3,&local_b290);
                local_b391 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_b4a0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_b4a1);
                std::__cxx11::string::string(local_b480,local_b4a0);
                lest::location::location(&local_b460,(text *)local_b480,0x55d);
                lest::location::location(&local_b438,&local_b460);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_b4e8,"e1 < 7",&local_b4e9);
                std::__cxx11::string::string(local_b4c8,local_b4e8);
                std::__cxx11::string::string((string *)(local_b550 + 0x40),(string *)&score_36);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_b410,&local_b438,(text *)local_b4c8,
                           (text *)(local_b550 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_b550);
                std::__cxx11::string::string((string *)(local_b550 + 0x20),(string *)local_b550);
                lest::report(poVar1,&local_b410,(text *)(local_b550 + 0x20));
                std::__cxx11::string::~string((string *)(local_b550 + 0x20));
                std::__cxx11::string::~string((string *)local_b550);
                lest::passing::~passing((passing *)&local_b410);
                std::__cxx11::string::~string((string *)(local_b550 + 0x40));
                std::__cxx11::string::~string(local_b4c8);
                std::__cxx11::string::~string(local_b4e8);
                std::allocator<char>::~allocator((allocator<char> *)&local_b4e9);
                lest::location::~location(&local_b438);
                lest::location::~location(&local_b460);
                std::__cxx11::string::~string(local_b480);
                std::__cxx11::string::~string(local_b4a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_b4a1);
              }
              lest::result::~result((result *)local_b1e0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x106;
          lest::ctx::~ctx((ctx *)local_b170);
          lest__ctx_section_36._8_4_ =
               lest__ctx_section_36._8_4_ - (uint)(lest__ctx_section_36._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_38,&relop<char,_int,_long>::id1374,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_38);
      if (bVar2) {
        lest__ctx_section_37.once = true;
        lest__ctx_section_37._9_3_ = 0;
        for (lest__ctx_section_37._12_4_ = 0;
            (int)lest__ctx_section_37._12_4_ < (int)lest__ctx_section_37._8_4_;
            lest__ctx_section_37._12_4_ = lest__ctx_section_37._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_b698,"value     <  engaged",(allocator *)&score_37.field_0x27);
          std::__cxx11::string::string(local_b678,local_b698);
          lest::ctx::ctx((ctx *)local_b658,lest_env,(text *)local_b678);
          std::__cxx11::string::~string(local_b678);
          std::__cxx11::string::~string(local_b698);
          std::allocator<char>::~allocator((allocator<char> *)&score_37.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_b658), bVar2) {
            do {
              local_b700 = 6;
              local_b6f8 = (int *)lest::expression_decomposer::operator<<(&local_b6f9,&local_b700);
              lest::expression_lhs<int_const&>::operator<
                        (&local_b6f0,(expression_lhs<int_const&> *)&local_b6f8,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_b6c8,&local_b6f0);
              lest::result::~result(&local_b6f0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_b6c8);
              if (bVar2) {
                local_b879 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_b808,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_b809);
                std::__cxx11::string::string(local_b7e8,local_b808);
                lest::location::location(&local_b7c8,(text *)local_b7e8,0x55e);
                lest::location::location(&local_b7a0,&local_b7c8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_b850,"6 < e2",&local_b851);
                std::__cxx11::string::string(local_b830,local_b850);
                std::__cxx11::string::string(local_b878,(string *)&score_37);
                lest::failure::failure
                          (&local_b778,&local_b7a0,(text *)local_b830,(text *)local_b878);
                lest::failure::failure(pfVar3,&local_b778);
                local_b879 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_b988,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_b989);
                std::__cxx11::string::string(local_b968,local_b988);
                lest::location::location(&local_b948,(text *)local_b968,0x55e);
                lest::location::location(&local_b920,&local_b948);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_b9d0,"6 < e2",&local_b9d1);
                std::__cxx11::string::string(local_b9b0,local_b9d0);
                std::__cxx11::string::string((string *)(local_ba38 + 0x40),(string *)&score_37);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_b8f8,&local_b920,(text *)local_b9b0,
                           (text *)(local_ba38 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_ba38);
                std::__cxx11::string::string((string *)(local_ba38 + 0x20),(string *)local_ba38);
                lest::report(poVar1,&local_b8f8,(text *)(local_ba38 + 0x20));
                std::__cxx11::string::~string((string *)(local_ba38 + 0x20));
                std::__cxx11::string::~string((string *)local_ba38);
                lest::passing::~passing((passing *)&local_b8f8);
                std::__cxx11::string::~string((string *)(local_ba38 + 0x40));
                std::__cxx11::string::~string(local_b9b0);
                std::__cxx11::string::~string(local_b9d0);
                std::allocator<char>::~allocator((allocator<char> *)&local_b9d1);
                lest::location::~location(&local_b920);
                lest::location::~location(&local_b948);
                std::__cxx11::string::~string(local_b968);
                std::__cxx11::string::~string(local_b988);
                std::allocator<char>::~allocator((allocator<char> *)&local_b989);
              }
              lest::result::~result((result *)local_b6c8);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x10d;
          lest::ctx::~ctx((ctx *)local_b658);
          lest__ctx_section_37._8_4_ =
               lest__ctx_section_37._8_4_ - (uint)(lest__ctx_section_37._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_39,&relop<char,_int,_long>::id1375,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_39);
      if (bVar2) {
        lest__ctx_section_38.once = true;
        lest__ctx_section_38._9_3_ = 0;
        for (lest__ctx_section_38._12_4_ = 0;
            (int)lest__ctx_section_38._12_4_ < (int)lest__ctx_section_38._8_4_;
            lest__ctx_section_38._12_4_ = lest__ctx_section_38._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_bb80,"engaged   <= value",(allocator *)&score_38.field_0x27);
          std::__cxx11::string::string(local_bb60,local_bb80);
          lest::ctx::ctx((ctx *)local_bb40,lest_env,(text *)local_bb60);
          std::__cxx11::string::~string(local_bb60);
          std::__cxx11::string::~string(local_bb80);
          std::allocator<char>::~allocator((allocator<char> *)&score_38.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_bb40), bVar2) {
            do {
              local_bbe0 = (optional<int> *)
                           lest::expression_decomposer::operator<<
                                     (&local_bbe1,(optional<int> *)((long)&e2.contained + 4));
              local_bbe8 = 7;
              lest::expression_lhs<nonstd::optional_lite::optional<int>const&>::operator<=
                        (&local_bbd8,
                         (expression_lhs<nonstd::optional_lite::optional<int>const&> *)&local_bbe0,
                         &local_bbe8);
              lest::result::result((result *)local_bbb0,&local_bbd8);
              lest::result::~result(&local_bbd8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_bbb0);
              if (bVar2) {
                local_bd61 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_bcf0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_bcf1);
                std::__cxx11::string::string(local_bcd0,local_bcf0);
                lest::location::location(&local_bcb0,(text *)local_bcd0,0x55f);
                lest::location::location(&local_bc88,&local_bcb0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_bd38,"e1 <= 7",&local_bd39);
                std::__cxx11::string::string(local_bd18,local_bd38);
                std::__cxx11::string::string(local_bd60,(string *)&score_38);
                lest::failure::failure
                          (&local_bc60,&local_bc88,(text *)local_bd18,(text *)local_bd60);
                lest::failure::failure(pfVar3,&local_bc60);
                local_bd61 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_be70,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_be71);
                std::__cxx11::string::string(local_be50,local_be70);
                lest::location::location(&local_be30,(text *)local_be50,0x55f);
                lest::location::location(&local_be08,&local_be30);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_beb8,"e1 <= 7",&local_beb9);
                std::__cxx11::string::string(local_be98,local_beb8);
                std::__cxx11::string::string((string *)(local_bf20 + 0x40),(string *)&score_38);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_bde0,&local_be08,(text *)local_be98,
                           (text *)(local_bf20 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_bf20);
                std::__cxx11::string::string((string *)(local_bf20 + 0x20),(string *)local_bf20);
                lest::report(poVar1,&local_bde0,(text *)(local_bf20 + 0x20));
                std::__cxx11::string::~string((string *)(local_bf20 + 0x20));
                std::__cxx11::string::~string((string *)local_bf20);
                lest::passing::~passing((passing *)&local_bde0);
                std::__cxx11::string::~string((string *)(local_bf20 + 0x40));
                std::__cxx11::string::~string(local_be98);
                std::__cxx11::string::~string(local_beb8);
                std::allocator<char>::~allocator((allocator<char> *)&local_beb9);
                lest::location::~location(&local_be08);
                lest::location::~location(&local_be30);
                std::__cxx11::string::~string(local_be50);
                std::__cxx11::string::~string(local_be70);
                std::allocator<char>::~allocator((allocator<char> *)&local_be71);
              }
              lest::result::~result((result *)local_bbb0);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x114;
          lest::ctx::~ctx((ctx *)local_bb40);
          lest__ctx_section_38._8_4_ =
               lest__ctx_section_38._8_4_ - (uint)(lest__ctx_section_38._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_40,&relop<char,_int,_long>::id1376,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_40);
      if (bVar2) {
        lest__ctx_section_39.once = true;
        lest__ctx_section_39._9_3_ = 0;
        for (lest__ctx_section_39._12_4_ = 0;
            (int)lest__ctx_section_39._12_4_ < (int)lest__ctx_section_39._8_4_;
            lest__ctx_section_39._12_4_ = lest__ctx_section_39._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_c068,"value     <= engaged",(allocator *)&score_39.field_0x27);
          std::__cxx11::string::string(local_c048,local_c068);
          lest::ctx::ctx((ctx *)local_c028,lest_env,(text *)local_c048);
          std::__cxx11::string::~string(local_c048);
          std::__cxx11::string::~string(local_c068);
          std::allocator<char>::~allocator((allocator<char> *)&score_39.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_c028), bVar2) {
            do {
              local_c0d0 = 6;
              local_c0c8 = (int *)lest::expression_decomposer::operator<<(&local_c0c9,&local_c0d0);
              lest::expression_lhs<int_const&>::operator<=
                        (&local_c0c0,(expression_lhs<int_const&> *)&local_c0c8,
                         (optional<long> *)local_a0);
              lest::result::result((result *)local_c098,&local_c0c0);
              lest::result::~result(&local_c0c0);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_c098);
              if (bVar2) {
                local_c249 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_c1d8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_c1d9);
                std::__cxx11::string::string(local_c1b8,local_c1d8);
                lest::location::location(&local_c198,(text *)local_c1b8,0x560);
                lest::location::location(&local_c170,&local_c198);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_c220,"6 <= e2",&local_c221);
                std::__cxx11::string::string(local_c200,local_c220);
                std::__cxx11::string::string(local_c248,(string *)&score_39);
                lest::failure::failure
                          (&local_c148,&local_c170,(text *)local_c200,(text *)local_c248);
                lest::failure::failure(pfVar3,&local_c148);
                local_c249 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_c358,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_c359);
                std::__cxx11::string::string(local_c338,local_c358);
                lest::location::location(&local_c318,(text *)local_c338,0x560);
                lest::location::location(&local_c2f0,&local_c318);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_c3a0,"6 <= e2",&local_c3a1);
                std::__cxx11::string::string(local_c380,local_c3a0);
                std::__cxx11::string::string((string *)(local_c408 + 0x40),(string *)&score_39);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_c2c8,&local_c2f0,(text *)local_c380,
                           (text *)(local_c408 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_c408);
                std::__cxx11::string::string((string *)(local_c408 + 0x20),(string *)local_c408);
                lest::report(poVar1,&local_c2c8,(text *)(local_c408 + 0x20));
                std::__cxx11::string::~string((string *)(local_c408 + 0x20));
                std::__cxx11::string::~string((string *)local_c408);
                lest::passing::~passing((passing *)&local_c2c8);
                std::__cxx11::string::~string((string *)(local_c408 + 0x40));
                std::__cxx11::string::~string(local_c380);
                std::__cxx11::string::~string(local_c3a0);
                std::allocator<char>::~allocator((allocator<char> *)&local_c3a1);
                lest::location::~location(&local_c2f0);
                lest::location::~location(&local_c318);
                std::__cxx11::string::~string(local_c338);
                std::__cxx11::string::~string(local_c358);
                std::allocator<char>::~allocator((allocator<char> *)&local_c359);
              }
              lest::result::~result((result *)local_c098);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x11b;
          lest::ctx::~ctx((ctx *)local_c028);
          lest__ctx_section_39._8_4_ =
               lest__ctx_section_39._8_4_ - (uint)(lest__ctx_section_39._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_41,&relop<char,_int,_long>::id1377,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_41);
      if (bVar2) {
        lest__ctx_section_40.once = true;
        lest__ctx_section_40._9_3_ = 0;
        for (lest__ctx_section_40._12_4_ = 0;
            (int)lest__ctx_section_40._12_4_ < (int)lest__ctx_section_40._8_4_;
            lest__ctx_section_40._12_4_ = lest__ctx_section_40._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_c550,"engaged   >  value",(allocator *)&score_40.field_0x27);
          std::__cxx11::string::string(local_c530,local_c550);
          lest::ctx::ctx((ctx *)local_c510,lest_env,(text *)local_c530);
          std::__cxx11::string::~string(local_c530);
          std::__cxx11::string::~string(local_c550);
          std::allocator<char>::~allocator((allocator<char> *)&score_40.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_c510), bVar2) {
            do {
              local_c5b0 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_c5b1,(optional<long> *)local_a0);
              local_c5b8 = 6;
              lest::expression_lhs<nonstd::optional_lite::optional<long>const&>::operator>
                        (&local_c5a8,
                         (expression_lhs<nonstd::optional_lite::optional<long>const&> *)&local_c5b0,
                         &local_c5b8);
              lest::result::result((result *)local_c580,&local_c5a8);
              lest::result::~result(&local_c5a8);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_c580);
              if (bVar2) {
                local_c731 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_c6c0,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_c6c1);
                std::__cxx11::string::string(local_c6a0,local_c6c0);
                lest::location::location(&local_c680,(text *)local_c6a0,0x561);
                lest::location::location(&local_c658,&local_c680);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_c708,"e2 > 6",&local_c709);
                std::__cxx11::string::string(local_c6e8,local_c708);
                std::__cxx11::string::string(local_c730,(string *)&score_40);
                lest::failure::failure
                          (&local_c630,&local_c658,(text *)local_c6e8,(text *)local_c730);
                lest::failure::failure(pfVar3,&local_c630);
                local_c731 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_c840,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_c841);
                std::__cxx11::string::string(local_c820,local_c840);
                lest::location::location(&local_c800,(text *)local_c820,0x561);
                lest::location::location(&local_c7d8,&local_c800);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_c888,"e2 > 6",&local_c889);
                std::__cxx11::string::string(local_c868,local_c888);
                std::__cxx11::string::string((string *)(local_c8f0 + 0x40),(string *)&score_40);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_c7b0,&local_c7d8,(text *)local_c868,
                           (text *)(local_c8f0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_c8f0);
                std::__cxx11::string::string((string *)(local_c8f0 + 0x20),(string *)local_c8f0);
                lest::report(poVar1,&local_c7b0,(text *)(local_c8f0 + 0x20));
                std::__cxx11::string::~string((string *)(local_c8f0 + 0x20));
                std::__cxx11::string::~string((string *)local_c8f0);
                lest::passing::~passing((passing *)&local_c7b0);
                std::__cxx11::string::~string((string *)(local_c8f0 + 0x40));
                std::__cxx11::string::~string(local_c868);
                std::__cxx11::string::~string(local_c888);
                std::allocator<char>::~allocator((allocator<char> *)&local_c889);
                lest::location::~location(&local_c7d8);
                lest::location::~location(&local_c800);
                std::__cxx11::string::~string(local_c820);
                std::__cxx11::string::~string(local_c840);
                std::allocator<char>::~allocator((allocator<char> *)&local_c841);
              }
              lest::result::~result((result *)local_c580);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x122;
          lest::ctx::~ctx((ctx *)local_c510);
          lest__ctx_section_40._8_4_ =
               lest__ctx_section_40._8_4_ - (uint)(lest__ctx_section_40._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_42,&relop<char,_int,_long>::id1378,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_42);
      if (bVar2) {
        lest__ctx_section_41.once = true;
        lest__ctx_section_41._9_3_ = 0;
        for (lest__ctx_section_41._12_4_ = 0;
            (int)lest__ctx_section_41._12_4_ < (int)lest__ctx_section_41._8_4_;
            lest__ctx_section_41._12_4_ = lest__ctx_section_41._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_ca38,"value     >  engaged",(allocator *)&score_41.field_0x27);
          std::__cxx11::string::string(local_ca18,local_ca38);
          lest::ctx::ctx((ctx *)local_c9f8,lest_env,(text *)local_ca18);
          std::__cxx11::string::~string(local_ca18);
          std::__cxx11::string::~string(local_ca38);
          std::allocator<char>::~allocator((allocator<char> *)&score_41.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_c9f8), bVar2) {
            do {
              local_caa0 = 7;
              local_ca98 = (int *)lest::expression_decomposer::operator<<(&local_ca99,&local_caa0);
              lest::expression_lhs<int_const&>::operator>
                        (&local_ca90,(expression_lhs<int_const&> *)&local_ca98,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_ca68,&local_ca90);
              lest::result::~result(&local_ca90);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_ca68);
              if (bVar2) {
                local_cc19 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_cba8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_cba9);
                std::__cxx11::string::string(local_cb88,local_cba8);
                lest::location::location(&local_cb68,(text *)local_cb88,0x562);
                lest::location::location(&local_cb40,&local_cb68);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_cbf0,"7 > e1",&local_cbf1);
                std::__cxx11::string::string(local_cbd0,local_cbf0);
                std::__cxx11::string::string(local_cc18,(string *)&score_41);
                lest::failure::failure
                          (&local_cb18,&local_cb40,(text *)local_cbd0,(text *)local_cc18);
                lest::failure::failure(pfVar3,&local_cb18);
                local_cc19 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_cd28,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_cd29);
                std::__cxx11::string::string(local_cd08,local_cd28);
                lest::location::location(&local_cce8,(text *)local_cd08,0x562);
                lest::location::location(&local_ccc0,&local_cce8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_cd70,"7 > e1",&local_cd71);
                std::__cxx11::string::string(local_cd50,local_cd70);
                std::__cxx11::string::string((string *)(local_cdd8 + 0x40),(string *)&score_41);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_cc98,&local_ccc0,(text *)local_cd50,
                           (text *)(local_cdd8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_cdd8);
                std::__cxx11::string::string((string *)(local_cdd8 + 0x20),(string *)local_cdd8);
                lest::report(poVar1,&local_cc98,(text *)(local_cdd8 + 0x20));
                std::__cxx11::string::~string((string *)(local_cdd8 + 0x20));
                std::__cxx11::string::~string((string *)local_cdd8);
                lest::passing::~passing((passing *)&local_cc98);
                std::__cxx11::string::~string((string *)(local_cdd8 + 0x40));
                std::__cxx11::string::~string(local_cd50);
                std::__cxx11::string::~string(local_cd70);
                std::allocator<char>::~allocator((allocator<char> *)&local_cd71);
                lest::location::~location(&local_ccc0);
                lest::location::~location(&local_cce8);
                std::__cxx11::string::~string(local_cd08);
                std::__cxx11::string::~string(local_cd28);
                std::allocator<char>::~allocator((allocator<char> *)&local_cd29);
              }
              lest::result::~result((result *)local_ca68);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x129;
          lest::ctx::~ctx((ctx *)local_c9f8);
          lest__ctx_section_41._8_4_ =
               lest__ctx_section_41._8_4_ - (uint)(lest__ctx_section_41._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_43,&relop<char,_int,_long>::id1379,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_43);
      if (bVar2) {
        lest__ctx_section_42.once = true;
        lest__ctx_section_42._9_3_ = 0;
        for (lest__ctx_section_42._12_4_ = 0;
            (int)lest__ctx_section_42._12_4_ < (int)lest__ctx_section_42._8_4_;
            lest__ctx_section_42._12_4_ = lest__ctx_section_42._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_cf20,"engaged   >= value",(allocator *)&score_42.field_0x27);
          std::__cxx11::string::string(local_cf00,local_cf20);
          lest::ctx::ctx((ctx *)local_cee0,lest_env,(text *)local_cf00);
          std::__cxx11::string::~string(local_cf00);
          std::__cxx11::string::~string(local_cf20);
          std::allocator<char>::~allocator((allocator<char> *)&score_42.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_cee0), bVar2) {
            do {
              local_cf80 = (optional<long> *)
                           lest::expression_decomposer::operator<<
                                     (&local_cf81,(optional<long> *)local_a0);
              local_cf88 = 6;
              lest::expression_lhs<nonstd::optional_lite::optional<long>const&>::operator>=
                        (&local_cf78,
                         (expression_lhs<nonstd::optional_lite::optional<long>const&> *)&local_cf80,
                         &local_cf88);
              lest::result::result((result *)local_cf50,&local_cf78);
              lest::result::~result(&local_cf78);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_cf50);
              if (bVar2) {
                local_d101 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_d090,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_d091);
                std::__cxx11::string::string(local_d070,local_d090);
                lest::location::location(&local_d050,(text *)local_d070,0x563);
                lest::location::location(&local_d028,&local_d050);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_d0d8,"e2 >= 6",&local_d0d9);
                std::__cxx11::string::string(local_d0b8,local_d0d8);
                std::__cxx11::string::string(local_d100,(string *)&score_42);
                lest::failure::failure
                          (&local_d000,&local_d028,(text *)local_d0b8,(text *)local_d100);
                lest::failure::failure(pfVar3,&local_d000);
                local_d101 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_d210,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_d211);
                std::__cxx11::string::string(local_d1f0,local_d210);
                lest::location::location(&local_d1d0,(text *)local_d1f0,0x563);
                lest::location::location(&local_d1a8,&local_d1d0);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_d258,"e2 >= 6",&local_d259);
                std::__cxx11::string::string(local_d238,local_d258);
                std::__cxx11::string::string((string *)(local_d2c0 + 0x40),(string *)&score_42);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_d180,&local_d1a8,(text *)local_d238,
                           (text *)(local_d2c0 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_d2c0);
                std::__cxx11::string::string((string *)(local_d2c0 + 0x20),(string *)local_d2c0);
                lest::report(poVar1,&local_d180,(text *)(local_d2c0 + 0x20));
                std::__cxx11::string::~string((string *)(local_d2c0 + 0x20));
                std::__cxx11::string::~string((string *)local_d2c0);
                lest::passing::~passing((passing *)&local_d180);
                std::__cxx11::string::~string((string *)(local_d2c0 + 0x40));
                std::__cxx11::string::~string(local_d238);
                std::__cxx11::string::~string(local_d258);
                std::allocator<char>::~allocator((allocator<char> *)&local_d259);
                lest::location::~location(&local_d1a8);
                lest::location::~location(&local_d1d0);
                std::__cxx11::string::~string(local_d1f0);
                std::__cxx11::string::~string(local_d210);
                std::allocator<char>::~allocator((allocator<char> *)&local_d211);
              }
              lest::result::~result((result *)local_cf50);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x130;
          lest::ctx::~ctx((ctx *)local_cee0);
          lest__ctx_section_42._8_4_ =
               lest__ctx_section_42._8_4_ - (uint)(lest__ctx_section_42._12_4_ == 0);
        }
      }
      lest::guard::guard((guard *)&lest__count_44,&relop<char,_int,_long>::id1380,
                         (int *)&lest__ctx_setup.field_0xc,(int *)&lest__ctx_setup.once);
      bVar2 = lest::guard::operator_cast_to_bool((guard *)&lest__count_44);
      if (bVar2) {
        lest__ctx_section_43.once = true;
        lest__ctx_section_43._9_3_ = 0;
        for (lest__ctx_section_43._12_4_ = 0;
            (int)lest__ctx_section_43._12_4_ < (int)lest__ctx_section_43._8_4_;
            lest__ctx_section_43._12_4_ = lest__ctx_section_43._12_4_ + 1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_d408,"value     >= engaged",(allocator *)&score_43.field_0x27);
          std::__cxx11::string::string(local_d3e8,local_d408);
          lest::ctx::ctx((ctx *)local_d3c8,lest_env,(text *)local_d3e8);
          std::__cxx11::string::~string(local_d3e8);
          std::__cxx11::string::~string(local_d408);
          std::allocator<char>::~allocator((allocator<char> *)&score_43.field_0x27);
          while (bVar2 = lest::ctx::operator_cast_to_bool((ctx *)local_d3c8), bVar2) {
            do {
              local_d470 = 7;
              local_d468 = (int *)lest::expression_decomposer::operator<<(&local_d469,&local_d470);
              lest::expression_lhs<int_const&>::operator>=
                        (&local_d460,(expression_lhs<int_const&> *)&local_d468,
                         (optional<int> *)((long)&e2.contained + 4));
              lest::result::result((result *)local_d438,&local_d460);
              lest::result::~result(&local_d460);
              bVar2 = lest::result::operator_cast_to_bool((result *)local_d438);
              if (bVar2) {
                local_d5e9 = 1;
                pfVar3 = (failure *)__cxa_allocate_exception(0x78);
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_d578,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_d579);
                std::__cxx11::string::string(local_d558,local_d578);
                lest::location::location(&local_d538,(text *)local_d558,0x564);
                lest::location::location(&local_d510,&local_d538);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_d5c0,"7 >= e1",&local_d5c1);
                std::__cxx11::string::string(local_d5a0,local_d5c0);
                std::__cxx11::string::string(local_d5e8,(string *)&score_43);
                lest::failure::failure
                          (&local_d4e8,&local_d510,(text *)local_d5a0,(text *)local_d5e8);
                lest::failure::failure(pfVar3,&local_d4e8);
                local_d5e9 = 0;
                __cxa_throw(pfVar3,&lest::failure::typeinfo,lest::failure::~failure);
              }
              bVar2 = lest::env::pass(lest_env);
              if (bVar2) {
                poVar1 = lest_env->os;
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (local_d6f8,
                           "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]optional-lite/test/optional.t.cpp"
                           ,&local_d6f9);
                std::__cxx11::string::string(local_d6d8,local_d6f8);
                lest::location::location(&local_d6b8,(text *)local_d6d8,0x564);
                lest::location::location(&local_d690,&local_d6b8);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_d740,"7 >= e1",&local_d741);
                std::__cxx11::string::string(local_d720,local_d740);
                std::__cxx11::string::string((string *)(local_d7a8 + 0x40),(string *)&score_43);
                bVar2 = lest::env::zen(lest_env);
                lest::passing::passing
                          ((passing *)&local_d668,&local_d690,(text *)local_d720,
                           (text *)(local_d7a8 + 0x40),bVar2);
                lest::env::context_abi_cxx11_((env *)local_d7a8);
                std::__cxx11::string::string((string *)(local_d7a8 + 0x20),(string *)local_d7a8);
                lest::report(poVar1,&local_d668,(text *)(local_d7a8 + 0x20));
                std::__cxx11::string::~string((string *)(local_d7a8 + 0x20));
                std::__cxx11::string::~string((string *)local_d7a8);
                lest::passing::~passing((passing *)&local_d668);
                std::__cxx11::string::~string((string *)(local_d7a8 + 0x40));
                std::__cxx11::string::~string(local_d720);
                std::__cxx11::string::~string(local_d740);
                std::allocator<char>::~allocator((allocator<char> *)&local_d741);
                lest::location::~location(&local_d690);
                lest::location::~location(&local_d6b8);
                std::__cxx11::string::~string(local_d6d8);
                std::__cxx11::string::~string(local_d6f8);
                std::allocator<char>::~allocator((allocator<char> *)&local_d6f9);
              }
              lest::result::~result((result *)local_d438);
              bVar2 = lest::is_false();
            } while (bVar2);
          }
          e1.contained = (storage_t<int>)0x137;
          lest::ctx::~ctx((ctx *)local_d3c8);
          lest__ctx_section_43._8_4_ =
               lest__ctx_section_43._8_4_ - (uint)(lest__ctx_section_43._12_4_ == 0);
        }
      }
      nonstd::optional_lite::optional<long>::~optional((optional<long> *)local_a0);
      nonstd::optional_lite::optional<int>::~optional((optional<int> *)((long)&e2.contained + 4));
      nonstd::optional_lite::optional<char>::~optional((optional<char> *)&e1.field_0x2);
    }
    e1.contained = (storage_t<int>)0x5;
    lest::ctx::~ctx((ctx *)local_28);
    lest__ctx_setup._8_4_ = lest__ctx_setup._8_4_ - (uint)(lest__ctx_setup._12_4_ == 0);
    lest__ctx_setup._12_4_ = lest__ctx_setup._12_4_ + 1;
  } while( true );
}

Assistant:

void relop( lest::env & lest_env )
{
    SETUP( "" ) {
        optional<R> d;
        optional<S> e1( 6 );
        optional<T> e2( 7 );

    SECTION( "engaged    == engaged"    ) { EXPECT(   e1 == e1  ); }
    SECTION( "engaged    == disengaged" ) { EXPECT( !(e1 == d ) ); }
    SECTION( "disengaged == engaged"    ) { EXPECT( !(d  == e1) ); }

    SECTION( "engaged    != engaged"    ) { EXPECT(   e1 != e2  ); }
    SECTION( "engaged    != disengaged" ) { EXPECT(   e1 != d   ); }
    SECTION( "disengaged != engaged"    ) { EXPECT(   d  != e2  ); }

    SECTION( "engaged    <  engaged"    ) { EXPECT(   e1 <  e2  ); }
    SECTION( "engaged    <  disengaged" ) { EXPECT( !(e1 <  d ) ); }
    SECTION( "disengaged <  engaged"    ) { EXPECT(   d  <  e2  ); }

    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e1  ); }
    SECTION( "engaged    <= engaged"    ) { EXPECT(   e1 <= e2  ); }
    SECTION( "engaged    <= disengaged" ) { EXPECT( !(e1 <= d ) ); }
    SECTION( "disengaged <= engaged"    ) { EXPECT(   d  <= e2  ); }

    SECTION( "engaged    >  engaged"    ) { EXPECT(   e2 >  e1  ); }
    SECTION( "engaged    >  disengaged" ) { EXPECT(   e2 >  d   ); }
    SECTION( "disengaged >  engaged"    ) { EXPECT( !(d  >  e1) ); }

    SECTION( "engaged    >= engaged"    ) { EXPECT(   e1 >= e1  ); }
    SECTION( "engaged    >= engaged"    ) { EXPECT(   e2 >= e1  ); }
    SECTION( "engaged    >= disengaged" ) { EXPECT(   e2 >= d   ); }
    SECTION( "disengaged >= engaged"    ) { EXPECT( !(d  >= e1) ); }

    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       == nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt == d      ) ); }
    SECTION( "engaged    == nullopt"    ) { EXPECT(  (e1      != nullopt) ); }
    SECTION( "nullopt    == engaged"    ) { EXPECT(  (nullopt != e1     ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       <  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt <  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       <= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt <= d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT( !(d       >  nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT( !(nullopt >  d      ) ); }
    SECTION( "disengaged == nullopt"    ) { EXPECT(  (d       >= nullopt) ); }
    SECTION( "nullopt    == disengaged" ) { EXPECT(  (nullopt >= d      ) ); }

    SECTION( "engaged    == value"      ) { EXPECT( e1 == 6  ); }
    SECTION( "value     == engaged"     ) { EXPECT(  6 == e1 ); }
    SECTION( "engaged   != value"       ) { EXPECT( e1 != 7  ); }
    SECTION( "value     != engaged"     ) { EXPECT(  6 != e2 ); }
    SECTION( "engaged   <  value"       ) { EXPECT( e1 <  7  ); }
    SECTION( "value     <  engaged"     ) { EXPECT(  6 <  e2 ); }
    SECTION( "engaged   <= value"       ) { EXPECT( e1 <= 7  ); }
    SECTION( "value     <= engaged"     ) { EXPECT(  6 <= e2 ); }
    SECTION( "engaged   >  value"       ) { EXPECT( e2 >  6  ); }
    SECTION( "value     >  engaged"     ) { EXPECT(  7 >  e1 ); }
    SECTION( "engaged   >= value"       ) { EXPECT( e2 >= 6  ); }
    SECTION( "value     >= engaged"     ) { EXPECT(  7 >= e1 ); }
    }
}